

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  byte bVar45;
  byte bVar46;
  byte bVar47;
  ulong uVar48;
  long lVar49;
  byte bVar50;
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  int iVar54;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  Primitive *pPVar55;
  uint uVar56;
  bool bVar57;
  undefined1 uVar58;
  bool bVar59;
  undefined1 uVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar135;
  uint uVar136;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  float pp;
  undefined1 auVar218 [32];
  float fVar142;
  undefined4 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar151 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar157;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar165 [32];
  undefined1 auVar158 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar240;
  undefined1 auVar239 [32];
  undefined1 auVar241 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  Primitive *local_8f8;
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  
  PVar2 = prim[1];
  uVar61 = (ulong)(byte)PVar2;
  lVar49 = uVar61 * 0x19;
  fVar202 = *(float *)(prim + lVar49 + 0x12);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar70 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar73 = vsubps_avx(auVar66,*(undefined1 (*) [16])(prim + lVar49 + 6));
  fVar201 = fVar202 * auVar73._0_4_;
  fVar142 = fVar202 * auVar70._0_4_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar61 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar66);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar61 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar12);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar61 * 6 + 6);
  auVar83 = vpmovsxbd_avx2(auVar67);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar84 = vpmovsxbd_avx2(auVar1);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar89 = vpmovsxbd_avx2(auVar64);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vcvtdq2ps_avx(auVar89);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar61 + 6);
  auVar81 = vpmovsxbd_avx2(auVar72);
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar48 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar48 + 6);
  auVar86 = vpmovsxbd_avx2(auVar68);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar48 + uVar61 + 6);
  auVar87 = vpmovsxbd_avx2(auVar65);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar52 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar52 + 6);
  auVar79 = vpmovsxbd_avx2(auVar69);
  auVar88 = vcvtdq2ps_avx(auVar79);
  auVar99._4_4_ = fVar142;
  auVar99._0_4_ = fVar142;
  auVar99._8_4_ = fVar142;
  auVar99._12_4_ = fVar142;
  auVar99._16_4_ = fVar142;
  auVar99._20_4_ = fVar142;
  auVar99._24_4_ = fVar142;
  auVar99._28_4_ = fVar142;
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  auVar77 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar91 = ZEXT1632(CONCAT412(fVar202 * auVar70._12_4_,
                               CONCAT48(fVar202 * auVar70._8_4_,
                                        CONCAT44(fVar202 * auVar70._4_4_,fVar142))));
  auVar90 = vpermps_avx2(auVar101,auVar91);
  auVar78 = vpermps_avx512vl(auVar77,auVar91);
  fVar142 = auVar78._0_4_;
  fVar157 = auVar78._4_4_;
  auVar91._4_4_ = fVar157 * auVar83._4_4_;
  auVar91._0_4_ = fVar142 * auVar83._0_4_;
  fVar169 = auVar78._8_4_;
  auVar91._8_4_ = fVar169 * auVar83._8_4_;
  fVar170 = auVar78._12_4_;
  auVar91._12_4_ = fVar170 * auVar83._12_4_;
  fVar171 = auVar78._16_4_;
  auVar91._16_4_ = fVar171 * auVar83._16_4_;
  fVar173 = auVar78._20_4_;
  auVar91._20_4_ = fVar173 * auVar83._20_4_;
  fVar172 = auVar78._24_4_;
  auVar91._24_4_ = fVar172 * auVar83._24_4_;
  auVar91._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar81._4_4_ * fVar157;
  auVar89._0_4_ = auVar81._0_4_ * fVar142;
  auVar89._8_4_ = auVar81._8_4_ * fVar169;
  auVar89._12_4_ = auVar81._12_4_ * fVar170;
  auVar89._16_4_ = auVar81._16_4_ * fVar171;
  auVar89._20_4_ = auVar81._20_4_ * fVar173;
  auVar89._24_4_ = auVar81._24_4_ * fVar172;
  auVar89._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar88._4_4_ * fVar157;
  auVar79._0_4_ = auVar88._0_4_ * fVar142;
  auVar79._8_4_ = auVar88._8_4_ * fVar169;
  auVar79._12_4_ = auVar88._12_4_ * fVar170;
  auVar79._16_4_ = auVar88._16_4_ * fVar171;
  auVar79._20_4_ = auVar88._20_4_ * fVar173;
  auVar79._24_4_ = auVar88._24_4_ * fVar172;
  auVar79._28_4_ = auVar78._28_4_;
  auVar66 = vfmadd231ps_fma(auVar91,auVar90,auVar80);
  auVar12 = vfmadd231ps_fma(auVar89,auVar90,auVar85);
  auVar67 = vfmadd231ps_fma(auVar79,auVar87,auVar90);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar99,auVar82);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar99,auVar84);
  auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar86,auVar99);
  auVar100._4_4_ = fVar201;
  auVar100._0_4_ = fVar201;
  auVar100._8_4_ = fVar201;
  auVar100._12_4_ = fVar201;
  auVar100._16_4_ = fVar201;
  auVar100._20_4_ = fVar201;
  auVar100._24_4_ = fVar201;
  auVar100._28_4_ = fVar201;
  auVar79 = ZEXT1632(CONCAT412(fVar202 * auVar73._12_4_,
                               CONCAT48(fVar202 * auVar73._8_4_,
                                        CONCAT44(fVar202 * auVar73._4_4_,fVar201))));
  auVar89 = vpermps_avx2(auVar101,auVar79);
  auVar79 = vpermps_avx512vl(auVar77,auVar79);
  fVar202 = auVar79._0_4_;
  fVar142 = auVar79._4_4_;
  auVar90._4_4_ = fVar142 * auVar83._4_4_;
  auVar90._0_4_ = fVar202 * auVar83._0_4_;
  fVar157 = auVar79._8_4_;
  auVar90._8_4_ = fVar157 * auVar83._8_4_;
  fVar169 = auVar79._12_4_;
  auVar90._12_4_ = fVar169 * auVar83._12_4_;
  fVar170 = auVar79._16_4_;
  auVar90._16_4_ = fVar170 * auVar83._16_4_;
  fVar171 = auVar79._20_4_;
  auVar90._20_4_ = fVar171 * auVar83._20_4_;
  fVar173 = auVar79._24_4_;
  auVar90._24_4_ = fVar173 * auVar83._24_4_;
  auVar90._28_4_ = 1;
  auVar77._4_4_ = auVar81._4_4_ * fVar142;
  auVar77._0_4_ = auVar81._0_4_ * fVar202;
  auVar77._8_4_ = auVar81._8_4_ * fVar157;
  auVar77._12_4_ = auVar81._12_4_ * fVar169;
  auVar77._16_4_ = auVar81._16_4_ * fVar170;
  auVar77._20_4_ = auVar81._20_4_ * fVar171;
  auVar77._24_4_ = auVar81._24_4_ * fVar173;
  auVar77._28_4_ = auVar83._28_4_;
  auVar81._4_4_ = auVar88._4_4_ * fVar142;
  auVar81._0_4_ = auVar88._0_4_ * fVar202;
  auVar81._8_4_ = auVar88._8_4_ * fVar157;
  auVar81._12_4_ = auVar88._12_4_ * fVar169;
  auVar81._16_4_ = auVar88._16_4_ * fVar170;
  auVar81._20_4_ = auVar88._20_4_ * fVar171;
  auVar81._24_4_ = auVar88._24_4_ * fVar173;
  auVar81._28_4_ = auVar79._28_4_;
  auVar1 = vfmadd231ps_fma(auVar90,auVar89,auVar80);
  auVar64 = vfmadd231ps_fma(auVar77,auVar89,auVar85);
  auVar72 = vfmadd231ps_fma(auVar81,auVar89,auVar87);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar100,auVar82);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar100,auVar84);
  auVar96._8_4_ = 0x7fffffff;
  auVar96._0_8_ = 0x7fffffff7fffffff;
  auVar96._12_4_ = 0x7fffffff;
  auVar96._16_4_ = 0x7fffffff;
  auVar96._20_4_ = 0x7fffffff;
  auVar96._24_4_ = 0x7fffffff;
  auVar96._28_4_ = 0x7fffffff;
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar100,auVar86);
  auVar82 = vandps_avx(ZEXT1632(auVar66),auVar96);
  auVar98._8_4_ = 0x219392ef;
  auVar98._0_8_ = 0x219392ef219392ef;
  auVar98._12_4_ = 0x219392ef;
  auVar98._16_4_ = 0x219392ef;
  auVar98._20_4_ = 0x219392ef;
  auVar98._24_4_ = 0x219392ef;
  auVar98._28_4_ = 0x219392ef;
  uVar48 = vcmpps_avx512vl(auVar82,auVar98,1);
  bVar57 = (bool)((byte)uVar48 & 1);
  auVar78._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._0_4_;
  bVar57 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._4_4_;
  bVar57 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._8_4_;
  bVar57 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar66._12_4_;
  auVar78._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar78._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar78._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar78._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar12),auVar96);
  uVar48 = vcmpps_avx512vl(auVar82,auVar98,1);
  bVar57 = (bool)((byte)uVar48 & 1);
  auVar92._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar12._0_4_;
  bVar57 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar12._4_4_;
  bVar57 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar12._8_4_;
  bVar57 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar12._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar67),auVar96);
  uVar48 = vcmpps_avx512vl(auVar82,auVar98,1);
  bVar57 = (bool)((byte)uVar48 & 1);
  auVar82._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._0_4_;
  bVar57 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._4_4_;
  bVar57 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._8_4_;
  bVar57 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar67._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar97._16_4_ = 0x3f800000;
  auVar97._20_4_ = 0x3f800000;
  auVar97._24_4_ = 0x3f800000;
  auVar97._28_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar78,auVar80,auVar97);
  auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar92);
  auVar12 = vfnmadd213ps_fma(auVar92,auVar80,auVar97);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar82);
  auVar67 = vfnmadd213ps_fma(auVar82,auVar80,auVar97);
  auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar80,auVar80);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 7 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar1));
  auVar86._4_4_ = auVar66._4_4_ * auVar82._4_4_;
  auVar86._0_4_ = auVar66._0_4_ * auVar82._0_4_;
  auVar86._8_4_ = auVar66._8_4_ * auVar82._8_4_;
  auVar86._12_4_ = auVar66._12_4_ * auVar82._12_4_;
  auVar86._16_4_ = auVar82._16_4_ * 0.0;
  auVar86._20_4_ = auVar82._20_4_ * 0.0;
  auVar86._24_4_ = auVar82._24_4_ * 0.0;
  auVar86._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 9 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar1));
  auVar81 = vpbroadcastd_avx512vl();
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar95._0_4_ = auVar66._0_4_ * auVar82._0_4_;
  auVar95._4_4_ = auVar66._4_4_ * auVar82._4_4_;
  auVar95._8_4_ = auVar66._8_4_ * auVar82._8_4_;
  auVar95._12_4_ = auVar66._12_4_ * auVar82._12_4_;
  auVar95._16_4_ = auVar82._16_4_ * 0.0;
  auVar95._20_4_ = auVar82._20_4_ * 0.0;
  auVar95._24_4_ = auVar82._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar61 * -2 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar64));
  auVar87._4_4_ = auVar12._4_4_ * auVar82._4_4_;
  auVar87._0_4_ = auVar12._0_4_ * auVar82._0_4_;
  auVar87._8_4_ = auVar12._8_4_ * auVar82._8_4_;
  auVar87._12_4_ = auVar12._12_4_ * auVar82._12_4_;
  auVar87._16_4_ = auVar82._16_4_ * 0.0;
  auVar87._20_4_ = auVar82._20_4_ * 0.0;
  auVar87._24_4_ = auVar82._24_4_ * 0.0;
  auVar87._28_4_ = auVar82._28_4_;
  auVar82 = vcvtdq2ps_avx(auVar80);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar64));
  auVar94._0_4_ = auVar12._0_4_ * auVar82._0_4_;
  auVar94._4_4_ = auVar12._4_4_ * auVar82._4_4_;
  auVar94._8_4_ = auVar12._8_4_ * auVar82._8_4_;
  auVar94._12_4_ = auVar12._12_4_ * auVar82._12_4_;
  auVar94._16_4_ = auVar82._16_4_ * 0.0;
  auVar94._20_4_ = auVar82._20_4_ * 0.0;
  auVar94._24_4_ = auVar82._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 + uVar61 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar72));
  auVar88._4_4_ = auVar82._4_4_ * auVar67._4_4_;
  auVar88._0_4_ = auVar82._0_4_ * auVar67._0_4_;
  auVar88._8_4_ = auVar82._8_4_ * auVar67._8_4_;
  auVar88._12_4_ = auVar82._12_4_ * auVar67._12_4_;
  auVar88._16_4_ = auVar82._16_4_ * 0.0;
  auVar88._20_4_ = auVar82._20_4_ * 0.0;
  auVar88._24_4_ = auVar82._24_4_ * 0.0;
  auVar88._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 0x17 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar72));
  auVar93._0_4_ = auVar67._0_4_ * auVar82._0_4_;
  auVar93._4_4_ = auVar67._4_4_ * auVar82._4_4_;
  auVar93._8_4_ = auVar67._8_4_ * auVar82._8_4_;
  auVar93._12_4_ = auVar67._12_4_ * auVar82._12_4_;
  auVar93._16_4_ = auVar82._16_4_ * 0.0;
  auVar93._20_4_ = auVar82._20_4_ * 0.0;
  auVar93._24_4_ = auVar82._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar82 = vpminsd_avx2(auVar86,auVar95);
  auVar80 = vpminsd_avx2(auVar87,auVar94);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx2(auVar88,auVar93);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar83._4_4_ = uVar143;
  auVar83._0_4_ = uVar143;
  auVar83._8_4_ = uVar143;
  auVar83._12_4_ = uVar143;
  auVar83._16_4_ = uVar143;
  auVar83._20_4_ = uVar143;
  auVar83._24_4_ = uVar143;
  auVar83._28_4_ = uVar143;
  auVar80 = vmaxps_avx512vl(auVar80,auVar83);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx2(auVar86,auVar95);
  auVar80 = vpmaxsd_avx2(auVar87,auVar94);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx2(auVar88,auVar93);
  uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar84._4_4_ = uVar143;
  auVar84._0_4_ = uVar143;
  auVar84._8_4_ = uVar143;
  auVar84._12_4_ = uVar143;
  auVar84._16_4_ = uVar143;
  auVar84._20_4_ = uVar143;
  auVar84._24_4_ = uVar143;
  auVar84._28_4_ = uVar143;
  auVar80 = vminps_avx512vl(auVar80,auVar84);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar85._16_4_ = 0x3f800003;
  auVar85._20_4_ = 0x3f800003;
  auVar85._24_4_ = 0x3f800003;
  auVar85._28_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar85);
  uVar15 = vpcmpgtd_avx512vl(auVar81,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_5e0,auVar82,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return false;
  }
  local_8e8 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  pPVar55 = prim + lVar49 + 0x16;
  auVar156 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar156);
  local_8f8 = pPVar55;
  local_8f0 = prim;
LAB_01c7c859:
  iVar54 = 0;
  for (uVar48 = local_8e8; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
    iVar54 = iVar54 + 1;
  }
  local_8e8 = local_8e8 - 1 & local_8e8;
  uVar48 = (ulong)(uint)(iVar54 << 6);
  auVar66 = *(undefined1 (*) [16])(pPVar55 + uVar48);
  if (local_8e8 != 0) {
    uVar52 = local_8e8 - 1 & local_8e8;
    for (uVar61 = local_8e8; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar52 != 0) {
      for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar12 = *(undefined1 (*) [16])(pPVar55 + uVar48 + 0x10);
  auVar67 = *(undefined1 (*) [16])(pPVar55 + uVar48 + 0x20);
  auVar1 = *(undefined1 (*) [16])(pPVar55 + uVar48 + 0x30);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar72 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar56 = *(uint *)(prim + 2);
  local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar64 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar69 = auVar83._0_16_;
  local_9b0 = vinsertps_avx512f(auVar64,auVar69,0x28);
  auVar73._0_4_ = auVar66._0_4_ + auVar12._0_4_ + auVar67._0_4_ + auVar1._0_4_;
  auVar73._4_4_ = auVar66._4_4_ + auVar12._4_4_ + auVar67._4_4_ + auVar1._4_4_;
  auVar73._8_4_ = auVar66._8_4_ + auVar12._8_4_ + auVar67._8_4_ + auVar1._8_4_;
  auVar73._12_4_ = auVar66._12_4_ + auVar12._12_4_ + auVar67._12_4_ + auVar1._12_4_;
  auVar70._8_4_ = 0x3e800000;
  auVar70._0_8_ = 0x3e8000003e800000;
  auVar70._12_4_ = 0x3e800000;
  auVar64 = vmulps_avx512vl(auVar73,auVar70);
  auVar64 = vsubps_avx(auVar64,auVar72);
  auVar64 = vdpps_avx(auVar64,local_9b0,0x7f);
  fVar202 = *(float *)(ray + k * 4 + 0xc0);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  auVar74._4_12_ = ZEXT812(0) << 0x20;
  auVar74._0_4_ = local_9c0._0_4_;
  auVar65 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar74);
  auVar68 = vfnmadd213ss_fma(auVar65,local_9c0,ZEXT416(0x40000000));
  fVar142 = auVar64._0_4_ * auVar65._0_4_ * auVar68._0_4_;
  auVar71._4_4_ = fVar142;
  auVar71._0_4_ = fVar142;
  auVar71._8_4_ = fVar142;
  auVar71._12_4_ = fVar142;
  auVar64 = vfmadd231ps_fma(auVar72,local_9b0,auVar71);
  auVar64 = vblendps_avx(auVar64,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar64);
  auVar67 = vsubps_avx(auVar67,auVar64);
  auVar12 = vsubps_avx(auVar12,auVar64);
  auVar1 = vsubps_avx(auVar1,auVar64);
  uVar143 = auVar66._0_4_;
  auVar238._4_4_ = uVar143;
  auVar238._0_4_ = uVar143;
  auVar238._8_4_ = uVar143;
  auVar238._12_4_ = uVar143;
  auVar238._16_4_ = uVar143;
  auVar238._20_4_ = uVar143;
  auVar238._24_4_ = uVar143;
  auVar238._28_4_ = uVar143;
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  local_860 = ZEXT1632(auVar66);
  auVar84 = vpermps_avx512vl(auVar103,local_860);
  auVar104._8_4_ = 2;
  auVar104._0_8_ = 0x200000002;
  auVar104._12_4_ = 2;
  auVar104._16_4_ = 2;
  auVar104._20_4_ = 2;
  auVar104._24_4_ = 2;
  auVar104._28_4_ = 2;
  auVar82 = vpermps_avx2(auVar104,local_860);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  auVar80 = vpermps_avx2(auVar105,local_860);
  uVar143 = auVar12._0_4_;
  local_5a0._4_4_ = uVar143;
  local_5a0._0_4_ = uVar143;
  local_5a0._8_4_ = uVar143;
  local_5a0._12_4_ = uVar143;
  local_5a0._16_4_ = uVar143;
  local_5a0._20_4_ = uVar143;
  local_5a0._24_4_ = uVar143;
  local_5a0._28_4_ = uVar143;
  local_8a0 = ZEXT1632(auVar12);
  local_8e0 = vpermps_avx2(auVar103,local_8a0);
  auVar220 = ZEXT3264(local_8e0);
  auVar85 = vpermps_avx512vl(auVar104,local_8a0);
  auVar81 = vpermps_avx512vl(auVar105,local_8a0);
  auVar86 = vbroadcastss_avx512vl(auVar67);
  local_880 = ZEXT1632(auVar67);
  auVar87 = vpermps_avx512vl(auVar103,local_880);
  auVar88 = vpermps_avx512vl(auVar104,local_880);
  auVar89 = vpermps_avx512vl(auVar105,local_880);
  auVar79 = vbroadcastss_avx512vl(auVar1);
  _local_8c0 = ZEXT1632(auVar1);
  auVar90 = vpermps_avx512vl(auVar103,_local_8c0);
  auVar91 = vpermps_avx512vl(auVar104,_local_8c0);
  auVar77 = vpermps_avx512vl(auVar105,_local_8c0);
  auVar66 = vmulss_avx512f(auVar69,auVar69);
  auVar78 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar78,local_760,local_760);
  uVar143 = local_580._0_4_;
  local_560._4_4_ = uVar143;
  local_560._0_4_ = uVar143;
  local_560._8_4_ = uVar143;
  local_560._12_4_ = uVar143;
  local_560._16_4_ = uVar143;
  local_560._20_4_ = uVar143;
  local_560._24_4_ = uVar143;
  local_560._28_4_ = uVar143;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar102);
  local_960 = ZEXT416((uint)fVar142);
  local_5c0 = fVar202 - fVar142;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  auVar156 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar156);
  iVar54 = 1;
  uVar48 = 0;
  bVar57 = false;
  auVar156 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar156);
  auVar66 = vsqrtss_avx(local_9c0,local_9c0);
  auVar12 = vsqrtss_avx(local_9c0,local_9c0);
  local_970 = ZEXT816(0x3f80000000000000);
  auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar67 = vmovshdup_avx(local_970);
    auVar67 = vsubps_avx(auVar67,local_970);
    fVar157 = auVar67._0_4_;
    fVar173 = fVar157 * 0.04761905;
    auVar213._0_4_ = local_970._0_4_;
    auVar213._4_4_ = auVar213._0_4_;
    auVar213._8_4_ = auVar213._0_4_;
    auVar213._12_4_ = auVar213._0_4_;
    auVar213._16_4_ = auVar213._0_4_;
    auVar213._20_4_ = auVar213._0_4_;
    auVar213._24_4_ = auVar213._0_4_;
    auVar213._28_4_ = auVar213._0_4_;
    auVar234._4_4_ = fVar157;
    auVar234._0_4_ = fVar157;
    auVar234._8_4_ = fVar157;
    auVar234._12_4_ = fVar157;
    auVar234._16_4_ = fVar157;
    auVar234._20_4_ = fVar157;
    auVar234._24_4_ = fVar157;
    auVar234._28_4_ = fVar157;
    auVar67 = vfmadd231ps_fma(auVar213,auVar234,_DAT_01faff20);
    auVar225 = auVar156._0_32_;
    auVar78 = vsubps_avx(auVar225,ZEXT1632(auVar67));
    fVar157 = auVar67._0_4_;
    fVar169 = auVar67._4_4_;
    auVar121._4_4_ = local_5a0._4_4_ * fVar169;
    auVar121._0_4_ = local_5a0._0_4_ * fVar157;
    fVar170 = auVar67._8_4_;
    auVar121._8_4_ = local_5a0._8_4_ * fVar170;
    fVar171 = auVar67._12_4_;
    auVar121._12_4_ = local_5a0._12_4_ * fVar171;
    auVar121._16_4_ = local_5a0._16_4_ * 0.0;
    auVar121._20_4_ = local_5a0._20_4_ * 0.0;
    auVar121._24_4_ = local_5a0._24_4_ * 0.0;
    auVar121._28_4_ = DAT_01faff20._28_4_;
    auVar95 = ZEXT1632(auVar67);
    auVar111._4_4_ = auVar220._4_4_ * fVar169;
    auVar111._0_4_ = auVar220._0_4_ * fVar157;
    auVar111._8_4_ = auVar220._8_4_ * fVar170;
    auVar111._12_4_ = auVar220._12_4_ * fVar171;
    auVar111._16_4_ = auVar220._16_4_ * 0.0;
    auVar111._20_4_ = auVar220._20_4_ * 0.0;
    auVar111._24_4_ = auVar220._24_4_ * 0.0;
    auVar111._28_4_ = auVar213._0_4_;
    auVar92 = vmulps_avx512vl(auVar85,auVar95);
    auVar93 = vmulps_avx512vl(auVar81,auVar95);
    auVar1 = vfmadd231ps_fma(auVar121,auVar78,auVar238);
    auVar94 = vfmadd231ps_avx512vl(auVar111,auVar78,auVar84);
    auVar64 = vfmadd231ps_fma(auVar92,auVar78,auVar82);
    auVar72 = vfmadd231ps_fma(auVar93,auVar78,auVar80);
    auVar92 = vmulps_avx512vl(auVar86,auVar95);
    auVar99 = ZEXT1632(auVar67);
    auVar93 = vmulps_avx512vl(auVar87,auVar99);
    auVar95 = vmulps_avx512vl(auVar88,auVar99);
    auVar96 = vmulps_avx512vl(auVar89,auVar99);
    auVar68 = vfmadd231ps_fma(auVar92,auVar78,local_5a0);
    auVar65 = vfmadd231ps_fma(auVar93,auVar78,auVar220._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar95,auVar78,auVar85);
    auVar93 = vfmadd231ps_avx512vl(auVar96,auVar78,auVar81);
    auVar95 = vmulps_avx512vl(auVar79,auVar99);
    auVar96 = vmulps_avx512vl(auVar90,auVar99);
    auVar97 = vmulps_avx512vl(auVar91,auVar99);
    auVar98 = vmulps_avx512vl(auVar77,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar78,auVar86);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar78,auVar87);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar78,auVar88);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar78,auVar89);
    auVar112._28_4_ = auVar220._28_4_;
    auVar112._0_28_ =
         ZEXT1628(CONCAT412(fVar171 * auVar68._12_4_,
                            CONCAT48(fVar170 * auVar68._8_4_,
                                     CONCAT44(fVar169 * auVar68._4_4_,fVar157 * auVar68._0_4_))));
    auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar65));
    auVar100 = vmulps_avx512vl(ZEXT1632(auVar67),auVar92);
    auVar101 = vmulps_avx512vl(ZEXT1632(auVar67),auVar93);
    auVar67 = vfmadd231ps_fma(auVar112,auVar78,ZEXT1632(auVar1));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar78,auVar94);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar78,ZEXT1632(auVar64));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar78,ZEXT1632(auVar72));
    auVar230._0_4_ = auVar95._0_4_ * fVar157;
    auVar230._4_4_ = auVar95._4_4_ * fVar169;
    auVar230._8_4_ = auVar95._8_4_ * fVar170;
    auVar230._12_4_ = auVar95._12_4_ * fVar171;
    auVar230._16_4_ = auVar95._16_4_ * 0.0;
    auVar230._20_4_ = auVar95._20_4_ * 0.0;
    auVar230._24_4_ = auVar95._24_4_ * 0.0;
    auVar230._28_4_ = 0;
    auVar113._4_4_ = auVar96._4_4_ * fVar169;
    auVar113._0_4_ = auVar96._0_4_ * fVar157;
    auVar113._8_4_ = auVar96._8_4_ * fVar170;
    auVar113._12_4_ = auVar96._12_4_ * fVar171;
    auVar113._16_4_ = auVar96._16_4_ * 0.0;
    auVar113._20_4_ = auVar96._20_4_ * 0.0;
    auVar113._24_4_ = auVar96._24_4_ * 0.0;
    auVar113._28_4_ = auVar95._28_4_;
    auVar114._4_4_ = auVar97._4_4_ * fVar169;
    auVar114._0_4_ = auVar97._0_4_ * fVar157;
    auVar114._8_4_ = auVar97._8_4_ * fVar170;
    auVar114._12_4_ = auVar97._12_4_ * fVar171;
    auVar114._16_4_ = auVar97._16_4_ * 0.0;
    auVar114._20_4_ = auVar97._20_4_ * 0.0;
    auVar114._24_4_ = auVar97._24_4_ * 0.0;
    auVar114._28_4_ = auVar96._28_4_;
    auVar218._4_4_ = auVar98._4_4_ * fVar169;
    auVar218._0_4_ = auVar98._0_4_ * fVar157;
    auVar218._8_4_ = auVar98._8_4_ * fVar170;
    auVar218._12_4_ = auVar98._12_4_ * fVar171;
    auVar218._16_4_ = auVar98._16_4_ * 0.0;
    auVar218._20_4_ = auVar98._20_4_ * 0.0;
    auVar218._24_4_ = auVar98._24_4_ * 0.0;
    auVar218._28_4_ = auVar97._28_4_;
    auVar1 = vfmadd231ps_fma(auVar230,auVar78,ZEXT1632(auVar68));
    auVar64 = vfmadd231ps_fma(auVar113,auVar78,ZEXT1632(auVar65));
    auVar72 = vfmadd231ps_fma(auVar114,auVar78,auVar92);
    auVar68 = vfmadd231ps_fma(auVar218,auVar78,auVar93);
    auVar115._28_4_ = auVar94._28_4_;
    auVar115._0_28_ =
         ZEXT1628(CONCAT412(auVar64._12_4_ * fVar171,
                            CONCAT48(auVar64._8_4_ * fVar170,
                                     CONCAT44(auVar64._4_4_ * fVar169,auVar64._0_4_ * fVar157))));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar171 * auVar1._12_4_,
                                                 CONCAT48(fVar170 * auVar1._8_4_,
                                                          CONCAT44(fVar169 * auVar1._4_4_,
                                                                   fVar157 * auVar1._0_4_)))),
                              auVar78,ZEXT1632(auVar67));
    auVar96 = vfmadd231ps_avx512vl(auVar115,auVar78,auVar99);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar72._12_4_ * fVar171,
                                            CONCAT48(auVar72._8_4_ * fVar170,
                                                     CONCAT44(auVar72._4_4_ * fVar169,
                                                              auVar72._0_4_ * fVar157)))),auVar78,
                         auVar100);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar68._12_4_ * fVar171,
                                            CONCAT48(auVar68._8_4_ * fVar170,
                                                     CONCAT44(auVar68._4_4_ * fVar169,
                                                              auVar68._0_4_ * fVar157)))),auVar101,
                         auVar78);
    auVar78 = vsubps_avx(ZEXT1632(auVar1),ZEXT1632(auVar67));
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar64),auVar99);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar72),auVar100);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar68),auVar101);
    auVar239._0_4_ = fVar173 * auVar78._0_4_ * 3.0;
    auVar239._4_4_ = fVar173 * auVar78._4_4_ * 3.0;
    auVar239._8_4_ = fVar173 * auVar78._8_4_ * 3.0;
    auVar239._12_4_ = fVar173 * auVar78._12_4_ * 3.0;
    auVar239._16_4_ = fVar173 * auVar78._16_4_ * 3.0;
    auVar239._20_4_ = fVar173 * auVar78._20_4_ * 3.0;
    auVar239._24_4_ = fVar173 * auVar78._24_4_ * 3.0;
    auVar239._28_4_ = 0;
    auVar241._0_4_ = fVar173 * auVar93._0_4_ * 3.0;
    auVar241._4_4_ = fVar173 * auVar93._4_4_ * 3.0;
    auVar241._8_4_ = fVar173 * auVar93._8_4_ * 3.0;
    auVar241._12_4_ = fVar173 * auVar93._12_4_ * 3.0;
    auVar241._16_4_ = fVar173 * auVar93._16_4_ * 3.0;
    auVar241._20_4_ = fVar173 * auVar93._20_4_ * 3.0;
    auVar241._24_4_ = fVar173 * auVar93._24_4_ * 3.0;
    auVar241._28_4_ = 0;
    auVar120._4_4_ = fVar173 * auVar94._4_4_ * 3.0;
    auVar120._0_4_ = fVar173 * auVar94._0_4_ * 3.0;
    auVar120._8_4_ = fVar173 * auVar94._8_4_ * 3.0;
    auVar120._12_4_ = fVar173 * auVar94._12_4_ * 3.0;
    auVar120._16_4_ = fVar173 * auVar94._16_4_ * 3.0;
    auVar120._20_4_ = fVar173 * auVar94._20_4_ * 3.0;
    auVar120._24_4_ = fVar173 * auVar94._24_4_ * 3.0;
    auVar120._28_4_ = auVar98._28_4_;
    fVar157 = auVar95._0_4_ * 3.0 * fVar173;
    fVar169 = auVar95._4_4_ * 3.0 * fVar173;
    auVar116._4_4_ = fVar169;
    auVar116._0_4_ = fVar157;
    fVar170 = auVar95._8_4_ * 3.0 * fVar173;
    auVar116._8_4_ = fVar170;
    fVar171 = auVar95._12_4_ * 3.0 * fVar173;
    auVar116._12_4_ = fVar171;
    fVar172 = auVar95._16_4_ * 3.0 * fVar173;
    auVar116._16_4_ = fVar172;
    fVar201 = auVar95._20_4_ * 3.0 * fVar173;
    auVar116._20_4_ = fVar201;
    fVar174 = auVar95._24_4_ * 3.0 * fVar173;
    auVar116._24_4_ = fVar174;
    auVar116._28_4_ = fVar173;
    auVar67 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar67);
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01feed00,ZEXT1632(auVar67));
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,ZEXT1632(auVar67));
    auVar93 = ZEXT1632(auVar67);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar93);
    auVar226._0_4_ = auVar92._0_4_ + fVar157;
    auVar226._4_4_ = auVar92._4_4_ + fVar169;
    auVar226._8_4_ = auVar92._8_4_ + fVar170;
    auVar226._12_4_ = auVar92._12_4_ + fVar171;
    auVar226._16_4_ = auVar92._16_4_ + fVar172;
    auVar226._20_4_ = auVar92._20_4_ + fVar201;
    auVar226._24_4_ = auVar92._24_4_ + fVar174;
    auVar226._28_4_ = auVar92._28_4_ + fVar173;
    auVar78 = vmaxps_avx(auVar92,auVar226);
    auVar101 = vminps_avx512vl(auVar92,auVar226);
    auVar102 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar93);
    auVar103 = vpermt2ps_avx512vl(auVar239,_DAT_01feed00,auVar93);
    auVar104 = vpermt2ps_avx512vl(auVar241,_DAT_01feed00,auVar93);
    auVar115 = ZEXT1632(auVar67);
    auVar105 = vpermt2ps_avx512vl(auVar120,_DAT_01feed00,auVar115);
    auVar92 = vpermt2ps_avx512vl(auVar116,_DAT_01feed00,auVar115);
    auVar92 = vsubps_avx(auVar102,auVar92);
    auVar93 = vsubps_avx(auVar98,ZEXT1632(auVar65));
    auVar94 = vsubps_avx(auVar99,auVar96);
    auVar95 = vsubps_avx(auVar100,auVar97);
    auVar106 = vmulps_avx512vl(auVar94,auVar120);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar241,auVar95);
    auVar107 = vmulps_avx512vl(auVar95,auVar239);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar120,auVar93);
    auVar108 = vmulps_avx512vl(auVar93,auVar241);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar239,auVar94);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar107 = vmulps_avx512vl(auVar95,auVar95);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar94);
    auVar109 = vfmadd231ps_avx512vl(auVar107,auVar93,auVar93);
    auVar107 = vrcp14ps_avx512vl(auVar109);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar109,auVar225);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar106,auVar107);
    auVar108 = vmulps_avx512vl(auVar94,auVar105);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar104,auVar95);
    auVar110 = vmulps_avx512vl(auVar95,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar105,auVar93);
    auVar111 = vmulps_avx512vl(auVar93,auVar104);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar103,auVar94);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar107 = vmaxps_avx512vl(auVar92,auVar102);
    auVar78 = vmaxps_avx512vl(auVar78,auVar107);
    auVar110 = vaddps_avx512vl(auVar106,auVar78);
    auVar78 = vminps_avx(auVar92,auVar102);
    auVar78 = vminps_avx512vl(auVar101,auVar78);
    auVar78 = vsubps_avx512vl(auVar78,auVar106);
    auVar106._8_4_ = 0x3f800002;
    auVar106._0_8_ = 0x3f8000023f800002;
    auVar106._12_4_ = 0x3f800002;
    auVar106._16_4_ = 0x3f800002;
    auVar106._20_4_ = 0x3f800002;
    auVar106._24_4_ = 0x3f800002;
    auVar106._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar110,auVar106);
    auVar107._8_4_ = 0x3f7ffffc;
    auVar107._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar107._12_4_ = 0x3f7ffffc;
    auVar107._16_4_ = 0x3f7ffffc;
    auVar107._20_4_ = 0x3f7ffffc;
    auVar107._24_4_ = 0x3f7ffffc;
    auVar107._28_4_ = 0x3f7ffffc;
    auVar78 = vmulps_avx512vl(auVar78,auVar107);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar101 = vrsqrt14ps_avx512vl(auVar109);
    auVar108._8_4_ = 0xbf000000;
    auVar108._0_8_ = 0xbf000000bf000000;
    auVar108._12_4_ = 0xbf000000;
    auVar108._16_4_ = 0xbf000000;
    auVar108._20_4_ = 0xbf000000;
    auVar108._24_4_ = 0xbf000000;
    auVar108._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar109,auVar108);
    fVar157 = auVar101._0_4_;
    fVar169 = auVar101._4_4_;
    fVar170 = auVar101._8_4_;
    fVar171 = auVar101._12_4_;
    fVar173 = auVar101._16_4_;
    fVar172 = auVar101._20_4_;
    fVar201 = auVar101._24_4_;
    auVar117._4_4_ = fVar169 * fVar169 * fVar169 * auVar102._4_4_;
    auVar117._0_4_ = fVar157 * fVar157 * fVar157 * auVar102._0_4_;
    auVar117._8_4_ = fVar170 * fVar170 * fVar170 * auVar102._8_4_;
    auVar117._12_4_ = fVar171 * fVar171 * fVar171 * auVar102._12_4_;
    auVar117._16_4_ = fVar173 * fVar173 * fVar173 * auVar102._16_4_;
    auVar117._20_4_ = fVar172 * fVar172 * fVar172 * auVar102._20_4_;
    auVar117._24_4_ = fVar201 * fVar201 * fVar201 * auVar102._24_4_;
    auVar117._28_4_ = auVar110._28_4_;
    auVar109._8_4_ = 0x3fc00000;
    auVar109._0_8_ = 0x3fc000003fc00000;
    auVar109._12_4_ = 0x3fc00000;
    auVar109._16_4_ = 0x3fc00000;
    auVar109._20_4_ = 0x3fc00000;
    auVar109._24_4_ = 0x3fc00000;
    auVar109._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar117,auVar101,auVar109);
    auVar102 = vmulps_avx512vl(auVar93,auVar101);
    auVar106 = vmulps_avx512vl(auVar94,auVar101);
    auVar107 = vmulps_avx512vl(auVar95,auVar101);
    auVar218 = ZEXT1632(auVar65);
    auVar108 = vsubps_avx512vl(auVar115,auVar218);
    auVar109 = vsubps_avx512vl(auVar115,auVar96);
    auVar111 = vsubps_avx512vl(auVar115,auVar97);
    auVar110 = vmulps_avx512vl(auVar83,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_780,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_760,auVar108);
    auVar112 = vmulps_avx512vl(auVar111,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar113 = vmulps_avx512vl(auVar83,auVar107);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,local_780);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,local_760);
    auVar107 = vmulps_avx512vl(auVar111,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar106);
    auVar102 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar102);
    auVar106 = vmulps_avx512vl(auVar113,auVar113);
    auVar107 = vsubps_avx512vl(local_560,auVar106);
    auVar114 = vmulps_avx512vl(auVar113,auVar102);
    auVar110 = vsubps_avx512vl(auVar110,auVar114);
    auVar114 = vaddps_avx512vl(auVar110,auVar110);
    auVar110 = vmulps_avx512vl(auVar102,auVar102);
    auVar112 = vsubps_avx512vl(auVar112,auVar110);
    auVar92 = vsubps_avx512vl(auVar112,auVar92);
    local_7a0 = vmulps_avx512vl(auVar114,auVar114);
    auVar110._8_4_ = 0x40800000;
    auVar110._0_8_ = 0x4080000040800000;
    auVar110._12_4_ = 0x40800000;
    auVar110._16_4_ = 0x40800000;
    auVar110._20_4_ = 0x40800000;
    auVar110._24_4_ = 0x40800000;
    auVar110._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar107,auVar110);
    auVar110 = vmulps_avx512vl(_local_7c0,auVar92);
    auVar110 = vsubps_avx512vl(local_7a0,auVar110);
    uVar61 = vcmpps_avx512vl(auVar110,auVar115,5);
    bVar45 = (byte)uVar61;
    if (bVar45 == 0) {
      auVar156 = ZEXT3264(auVar225);
LAB_01c7d4ae:
      auVar220 = ZEXT3264(local_8e0);
    }
    else {
      local_740._0_32_ = auVar112;
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar115 = vaddps_avx512vl(auVar107,auVar107);
      local_840 = vrcp14ps_avx512vl(auVar115);
      in_ZMM31 = ZEXT3264(local_840);
      auVar116 = vfnmadd213ps_avx512vl(local_840,auVar115,auVar225);
      auVar116 = vfmadd132ps_avx512vl(auVar116,local_840,local_840);
      auVar225._8_4_ = 0x80000000;
      auVar225._0_8_ = 0x8000000080000000;
      auVar225._12_4_ = 0x80000000;
      auVar225._16_4_ = 0x80000000;
      auVar225._20_4_ = 0x80000000;
      auVar225._24_4_ = 0x80000000;
      auVar225._28_4_ = 0x80000000;
      local_9a0 = vxorps_avx512vl(auVar114,auVar225);
      auVar117 = vsubps_avx512vl(local_9a0,auVar110);
      local_9e0 = vmulps_avx512vl(auVar117,auVar116);
      auVar110 = vsubps_avx512vl(auVar110,auVar114);
      local_7e0 = vmulps_avx512vl(auVar110,auVar116);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar110,local_9e0);
      auVar118._0_4_ =
           (uint)(bVar45 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar110._0_4_;
      bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar59 * auVar116._4_4_ | (uint)!bVar59 * auVar110._4_4_;
      bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar59 * auVar116._8_4_ | (uint)!bVar59 * auVar110._8_4_;
      bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar59 * auVar116._12_4_ | (uint)!bVar59 * auVar110._12_4_;
      bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar59 * auVar116._16_4_ | (uint)!bVar59 * auVar110._16_4_;
      bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar59 * auVar116._20_4_ | (uint)!bVar59 * auVar110._20_4_;
      bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar59 * auVar116._24_4_ | (uint)!bVar59 * auVar110._24_4_;
      bVar59 = SUB81(uVar61 >> 7,0);
      auVar118._28_4_ = (uint)bVar59 * auVar116._28_4_ | (uint)!bVar59 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar110,local_7e0);
      auVar119._0_4_ =
           (uint)(bVar45 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar45 & 1) * auVar110._0_4_;
      bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar59 * auVar116._4_4_ | (uint)!bVar59 * auVar110._4_4_;
      bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar59 * auVar116._8_4_ | (uint)!bVar59 * auVar110._8_4_;
      bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar59 * auVar116._12_4_ | (uint)!bVar59 * auVar110._12_4_;
      bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar59 * auVar116._16_4_ | (uint)!bVar59 * auVar110._16_4_;
      bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar59 * auVar116._20_4_ | (uint)!bVar59 * auVar110._20_4_;
      bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar59 * auVar116._24_4_ | (uint)!bVar59 * auVar110._24_4_;
      bVar59 = SUB81(uVar61 >> 7,0);
      auVar119._28_4_ = (uint)bVar59 * auVar116._28_4_ | (uint)!bVar59 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar110);
      local_800 = vmaxps_avx512vl(local_580,auVar110);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar27);
      vandps_avx512vl(auVar107,auVar110);
      uVar52 = vcmpps_avx512vl(local_820,local_820,1);
      uVar61 = uVar61 & uVar52;
      bVar50 = (byte)uVar61;
      if (bVar50 != 0) {
        uVar52 = vcmpps_avx512vl(auVar92,_DAT_01faff00,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar107 = vblendmps_avx512vl(auVar92,auVar106);
        bVar51 = (byte)uVar52;
        uVar63 = (uint)(bVar51 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar51 & 1) * local_820._0_4_;
        bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
        uVar62 = (uint)bVar59 * auVar107._4_4_ | (uint)!bVar59 * local_820._4_4_;
        bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
        uVar135 = (uint)bVar59 * auVar107._8_4_ | (uint)!bVar59 * local_820._8_4_;
        bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
        uVar136 = (uint)bVar59 * auVar107._12_4_ | (uint)!bVar59 * local_820._12_4_;
        bVar59 = (bool)((byte)(uVar52 >> 4) & 1);
        uVar137 = (uint)bVar59 * auVar107._16_4_ | (uint)!bVar59 * local_820._16_4_;
        bVar59 = (bool)((byte)(uVar52 >> 5) & 1);
        uVar138 = (uint)bVar59 * auVar107._20_4_ | (uint)!bVar59 * local_820._20_4_;
        bVar59 = (bool)((byte)(uVar52 >> 6) & 1);
        uVar139 = (uint)bVar59 * auVar107._24_4_ | (uint)!bVar59 * local_820._24_4_;
        bVar59 = SUB81(uVar52 >> 7,0);
        uVar140 = (uint)bVar59 * auVar107._28_4_ | (uint)!bVar59 * local_820._28_4_;
        auVar118._0_4_ = (bVar50 & 1) * uVar63 | !(bool)(bVar50 & 1) * auVar118._0_4_;
        bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar118._4_4_ = bVar59 * uVar62 | !bVar59 * auVar118._4_4_;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar118._8_4_ = bVar59 * uVar135 | !bVar59 * auVar118._8_4_;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar118._12_4_ = bVar59 * uVar136 | !bVar59 * auVar118._12_4_;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar118._16_4_ = bVar59 * uVar137 | !bVar59 * auVar118._16_4_;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar118._20_4_ = bVar59 * uVar138 | !bVar59 * auVar118._20_4_;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar118._24_4_ = bVar59 * uVar139 | !bVar59 * auVar118._24_4_;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar118._28_4_ = bVar59 * uVar140 | !bVar59 * auVar118._28_4_;
        auVar92 = vblendmps_avx512vl(auVar106,auVar92);
        bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar52 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar52 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar52 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar52 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar52 >> 6) & 1);
        bVar11 = SUB81(uVar52 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar50 & 1) *
             ((uint)(bVar51 & 1) * auVar92._0_4_ | !(bool)(bVar51 & 1) * uVar63) |
             !(bool)(bVar50 & 1) * auVar119._0_4_;
        bVar5 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar5 * ((uint)bVar59 * auVar92._4_4_ | !bVar59 * uVar62) |
             !bVar5 * auVar119._4_4_;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar59 * ((uint)bVar6 * auVar92._8_4_ | !bVar6 * uVar135) |
             !bVar59 * auVar119._8_4_;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar59 * ((uint)bVar7 * auVar92._12_4_ | !bVar7 * uVar136) |
             !bVar59 * auVar119._12_4_;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar59 * ((uint)bVar8 * auVar92._16_4_ | !bVar8 * uVar137) |
             !bVar59 * auVar119._16_4_;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar59 * ((uint)bVar9 * auVar92._20_4_ | !bVar9 * uVar138) |
             !bVar59 * auVar119._20_4_;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar59 * ((uint)bVar10 * auVar92._24_4_ | !bVar10 * uVar139) |
             !bVar59 * auVar119._24_4_;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar59 * ((uint)bVar11 * auVar92._28_4_ | !bVar11 * uVar140) |
             !bVar59 * auVar119._28_4_;
        bVar45 = (~bVar50 | bVar51) & bVar45;
      }
      if ((bVar45 & 0x7f) == 0) {
        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01c7d4ae;
      }
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar105 = vxorps_avx512vl(auVar105,auVar92);
      auVar103 = vxorps_avx512vl(auVar103,auVar92);
      uVar63 = *(uint *)(ray + k * 4 + 0x200);
      auVar104 = vxorps_avx512vl(auVar104,auVar92);
      auVar67 = vsubss_avx512f(ZEXT416(uVar63),ZEXT416((uint)local_960._0_4_));
      auVar106 = vbroadcastss_avx512vl(auVar67);
      auVar106 = vminps_avx512vl(auVar106,auVar119);
      auVar44._4_4_ = fStack_5bc;
      auVar44._0_4_ = local_5c0;
      auVar44._8_4_ = fStack_5b8;
      auVar44._12_4_ = fStack_5b4;
      auVar44._16_4_ = fStack_5b0;
      auVar44._20_4_ = fStack_5ac;
      auVar44._24_4_ = fStack_5a8;
      auVar44._28_4_ = fStack_5a4;
      auVar107 = vmaxps_avx512vl(auVar44,auVar118);
      auVar110 = vmulps_avx512vl(auVar111,auVar120);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar241,auVar110);
      auVar67 = vfmadd213ps_fma(auVar108,auVar239,auVar109);
      in_ZMM31 = ZEXT3264(auVar83);
      auVar108 = vmulps_avx512vl(auVar83,auVar120);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_780,auVar241);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_760,auVar239);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar109);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar109,auVar110,1);
      auVar111 = vxorps_avx512vl(ZEXT1632(auVar67),auVar92);
      auVar120 = vrcp14ps_avx512vl(auVar108);
      auVar116 = vxorps_avx512vl(auVar108,auVar92);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar108,auVar117);
      auVar67 = vfmadd132ps_fma(auVar121,auVar120,auVar120);
      fVar157 = auVar67._0_4_ * auVar111._0_4_;
      fVar169 = auVar67._4_4_ * auVar111._4_4_;
      auVar33._4_4_ = fVar169;
      auVar33._0_4_ = fVar157;
      fVar170 = auVar67._8_4_ * auVar111._8_4_;
      auVar33._8_4_ = fVar170;
      fVar171 = auVar67._12_4_ * auVar111._12_4_;
      auVar33._12_4_ = fVar171;
      fVar173 = auVar111._16_4_ * 0.0;
      auVar33._16_4_ = fVar173;
      fVar172 = auVar111._20_4_ * 0.0;
      auVar33._20_4_ = fVar172;
      fVar201 = auVar111._24_4_ * 0.0;
      auVar33._24_4_ = fVar201;
      auVar33._28_4_ = auVar111._28_4_;
      uVar15 = vcmpps_avx512vl(auVar108,auVar116,1);
      bVar50 = (byte)uVar14 | (byte)uVar15;
      auVar236._8_4_ = 0xff800000;
      auVar236._0_8_ = 0xff800000ff800000;
      auVar236._12_4_ = 0xff800000;
      auVar236._16_4_ = 0xff800000;
      auVar236._20_4_ = 0xff800000;
      auVar236._24_4_ = 0xff800000;
      auVar236._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar33,auVar236);
      auVar122._0_4_ =
           (uint)(bVar50 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar120._0_4_;
      bVar59 = (bool)(bVar50 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar59 * auVar121._4_4_ | (uint)!bVar59 * auVar120._4_4_;
      bVar59 = (bool)(bVar50 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar59 * auVar121._8_4_ | (uint)!bVar59 * auVar120._8_4_;
      bVar59 = (bool)(bVar50 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar59 * auVar121._12_4_ | (uint)!bVar59 * auVar120._12_4_;
      bVar59 = (bool)(bVar50 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar59 * auVar121._16_4_ | (uint)!bVar59 * auVar120._16_4_;
      bVar59 = (bool)(bVar50 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar59 * auVar121._20_4_ | (uint)!bVar59 * auVar120._20_4_;
      bVar59 = (bool)(bVar50 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar59 * auVar121._24_4_ | (uint)!bVar59 * auVar120._24_4_;
      auVar122._28_4_ =
           (uint)(bVar50 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar50 >> 7) * auVar120._28_4_;
      auVar120 = vmaxps_avx512vl(auVar107,auVar122);
      uVar15 = vcmpps_avx512vl(auVar108,auVar116,6);
      bVar50 = (byte)uVar14 | (byte)uVar15;
      auVar123._0_4_ = (uint)(bVar50 & 1) * 0x7f800000 | (uint)!(bool)(bVar50 & 1) * (int)fVar157;
      bVar59 = (bool)(bVar50 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar169;
      bVar59 = (bool)(bVar50 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar170;
      bVar59 = (bool)(bVar50 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar171;
      bVar59 = (bool)(bVar50 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar173;
      bVar59 = (bool)(bVar50 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar172;
      bVar59 = (bool)(bVar50 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar201;
      auVar123._28_4_ =
           (uint)(bVar50 >> 7) * 0x7f800000 | (uint)!(bool)(bVar50 >> 7) * auVar111._28_4_;
      auVar106 = vminps_avx512vl(auVar106,auVar123);
      auVar67 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar67),auVar98);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar67),auVar99);
      auVar107 = ZEXT1632(auVar67);
      auVar100 = vsubps_avx512vl(auVar107,auVar100);
      auVar100 = vmulps_avx512vl(auVar100,auVar105);
      auVar99 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar99);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar98);
      auVar99 = vmulps_avx512vl(auVar83,auVar105);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_780,auVar104);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_760,auVar103);
      vandps_avx512vl(auVar99,auVar109);
      uVar14 = vcmpps_avx512vl(auVar99,auVar110,1);
      auVar98 = vxorps_avx512vl(auVar98,auVar92);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar103 = vxorps_avx512vl(auVar99,auVar92);
      auVar92 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar117);
      auVar67 = vfmadd132ps_fma(auVar92,auVar100,auVar100);
      fVar157 = auVar67._0_4_ * auVar98._0_4_;
      fVar169 = auVar67._4_4_ * auVar98._4_4_;
      auVar34._4_4_ = fVar169;
      auVar34._0_4_ = fVar157;
      fVar170 = auVar67._8_4_ * auVar98._8_4_;
      auVar34._8_4_ = fVar170;
      fVar171 = auVar67._12_4_ * auVar98._12_4_;
      auVar34._12_4_ = fVar171;
      fVar173 = auVar98._16_4_ * 0.0;
      auVar34._16_4_ = fVar173;
      fVar172 = auVar98._20_4_ * 0.0;
      auVar34._20_4_ = fVar172;
      fVar201 = auVar98._24_4_ * 0.0;
      auVar34._24_4_ = fVar201;
      auVar34._28_4_ = auVar98._28_4_;
      uVar15 = vcmpps_avx512vl(auVar99,auVar103,1);
      bVar50 = (byte)uVar14 | (byte)uVar15;
      auVar92 = vblendmps_avx512vl(auVar34,auVar236);
      auVar124._0_4_ =
           (uint)(bVar50 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar100._0_4_;
      bVar59 = (bool)(bVar50 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar59 * auVar92._4_4_ | (uint)!bVar59 * auVar100._4_4_;
      bVar59 = (bool)(bVar50 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar59 * auVar92._8_4_ | (uint)!bVar59 * auVar100._8_4_;
      bVar59 = (bool)(bVar50 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar59 * auVar92._12_4_ | (uint)!bVar59 * auVar100._12_4_;
      bVar59 = (bool)(bVar50 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar59 * auVar92._16_4_ | (uint)!bVar59 * auVar100._16_4_;
      bVar59 = (bool)(bVar50 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar59 * auVar92._20_4_ | (uint)!bVar59 * auVar100._20_4_;
      bVar59 = (bool)(bVar50 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar59 * auVar92._24_4_ | (uint)!bVar59 * auVar100._24_4_;
      auVar124._28_4_ =
           (uint)(bVar50 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar50 >> 7) * auVar100._28_4_;
      auVar92 = vmaxps_avx(auVar120,auVar124);
      uVar15 = vcmpps_avx512vl(auVar99,auVar103,6);
      bVar50 = (byte)uVar14 | (byte)uVar15;
      auVar125._0_4_ = (uint)(bVar50 & 1) * 0x7f800000 | (uint)!(bool)(bVar50 & 1) * (int)fVar157;
      bVar59 = (bool)(bVar50 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar169;
      bVar59 = (bool)(bVar50 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar170;
      bVar59 = (bool)(bVar50 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar171;
      bVar59 = (bool)(bVar50 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar173;
      bVar59 = (bool)(bVar50 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar172;
      bVar59 = (bool)(bVar50 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar201;
      auVar125._28_4_ =
           (uint)(bVar50 >> 7) * 0x7f800000 | (uint)!(bool)(bVar50 >> 7) * auVar98._28_4_;
      local_640 = vminps_avx(auVar106,auVar125);
      uVar14 = vcmpps_avx512vl(auVar92,local_640,2);
      bVar45 = bVar45 & 0x7f & (byte)uVar14;
      if (bVar45 == 0) {
        auVar156 = ZEXT3264(auVar117);
        goto LAB_01c7d4ae;
      }
      auVar98 = vmaxps_avx512vl(auVar107,auVar78);
      auVar78 = vfmadd213ps_avx512vl(local_9e0,auVar113,auVar102);
      fVar157 = auVar101._0_4_;
      fVar169 = auVar101._4_4_;
      auVar35._4_4_ = fVar169 * auVar78._4_4_;
      auVar35._0_4_ = fVar157 * auVar78._0_4_;
      fVar170 = auVar101._8_4_;
      auVar35._8_4_ = fVar170 * auVar78._8_4_;
      fVar171 = auVar101._12_4_;
      auVar35._12_4_ = fVar171 * auVar78._12_4_;
      fVar173 = auVar101._16_4_;
      auVar35._16_4_ = fVar173 * auVar78._16_4_;
      fVar172 = auVar101._20_4_;
      auVar35._20_4_ = fVar172 * auVar78._20_4_;
      fVar201 = auVar101._24_4_;
      auVar35._24_4_ = fVar201 * auVar78._24_4_;
      auVar35._28_4_ = auVar78._28_4_;
      auVar78 = vfmadd213ps_avx512vl(local_7e0,auVar113,auVar102);
      auVar36._4_4_ = fVar169 * auVar78._4_4_;
      auVar36._0_4_ = fVar157 * auVar78._0_4_;
      auVar36._8_4_ = fVar170 * auVar78._8_4_;
      auVar36._12_4_ = fVar171 * auVar78._12_4_;
      auVar36._16_4_ = fVar173 * auVar78._16_4_;
      auVar36._20_4_ = fVar172 * auVar78._20_4_;
      auVar36._24_4_ = fVar201 * auVar78._24_4_;
      auVar36._28_4_ = auVar124._28_4_;
      auVar78 = vminps_avx512vl(auVar35,auVar117);
      auVar99 = ZEXT832(0) << 0x20;
      auVar78 = vmaxps_avx(auVar78,ZEXT832(0) << 0x20);
      auVar100 = vminps_avx512vl(auVar36,auVar117);
      auVar37._4_4_ = (auVar78._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar78._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar78._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar78._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar78._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar78._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar78._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar78._28_4_ + 7.0;
      auVar67 = vfmadd213ps_fma(auVar37,auVar234,auVar213);
      local_520 = ZEXT1632(auVar67);
      auVar78 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
      auVar38._4_4_ = (auVar78._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar78._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar78._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar78._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar78._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar78._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar78._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar78._28_4_ + 7.0;
      auVar67 = vfmadd213ps_fma(auVar38,auVar234,auVar213);
      local_540 = ZEXT1632(auVar67);
      auVar39._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar39._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar39._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar39._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar39._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar39._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar39._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar39._28_4_ = auVar98._28_4_;
      auVar78 = vsubps_avx(auVar112,auVar39);
      auVar40._4_4_ = auVar78._4_4_ * (float)local_7c0._4_4_;
      auVar40._0_4_ = auVar78._0_4_ * (float)local_7c0._0_4_;
      auVar40._8_4_ = auVar78._8_4_ * fStack_7b8;
      auVar40._12_4_ = auVar78._12_4_ * fStack_7b4;
      auVar40._16_4_ = auVar78._16_4_ * fStack_7b0;
      auVar40._20_4_ = auVar78._20_4_ * fStack_7ac;
      auVar40._24_4_ = auVar78._24_4_ * fStack_7a8;
      auVar40._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_7a0,auVar40);
      uVar14 = vcmpps_avx512vl(auVar98,ZEXT832(0) << 0x20,5);
      bVar50 = (byte)uVar14;
      if (bVar50 == 0) {
        bVar50 = 0;
        auVar93 = ZEXT832(0) << 0x20;
        auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar126._8_4_ = 0x7f800000;
        auVar126._0_8_ = 0x7f8000007f800000;
        auVar126._12_4_ = 0x7f800000;
        auVar126._16_4_ = 0x7f800000;
        auVar126._20_4_ = 0x7f800000;
        auVar126._24_4_ = 0x7f800000;
        auVar126._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        uVar61 = vcmpps_avx512vl(auVar98,auVar107,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar99 = vfnmadd213ps_avx512vl(auVar115,local_840,auVar117);
        auVar103 = vfmadd132ps_avx512vl(auVar99,local_840,local_840);
        auVar99 = vsubps_avx(local_9a0,auVar98);
        auVar104 = vmulps_avx512vl(auVar99,auVar103);
        auVar98 = vsubps_avx512vl(auVar98,auVar114);
        auVar105 = vmulps_avx512vl(auVar98,auVar103);
        auVar98 = vfmadd213ps_avx512vl(auVar113,auVar104,auVar102);
        auVar41._4_4_ = fVar169 * auVar98._4_4_;
        auVar41._0_4_ = fVar157 * auVar98._0_4_;
        auVar41._8_4_ = fVar170 * auVar98._8_4_;
        auVar41._12_4_ = fVar171 * auVar98._12_4_;
        auVar41._16_4_ = fVar173 * auVar98._16_4_;
        auVar41._20_4_ = fVar172 * auVar98._20_4_;
        auVar41._24_4_ = fVar201 * auVar98._24_4_;
        auVar41._28_4_ = auVar100._28_4_;
        auVar98 = vmulps_avx512vl(local_760,auVar104);
        auVar99 = vmulps_avx512vl(local_780,auVar104);
        auVar106 = vmulps_avx512vl(auVar83,auVar104);
        auVar100 = vfmadd213ps_avx512vl(auVar93,auVar41,auVar218);
        auVar100 = vsubps_avx512vl(auVar98,auVar100);
        auVar98 = vfmadd213ps_avx512vl(auVar94,auVar41,auVar96);
        auVar103 = vsubps_avx512vl(auVar99,auVar98);
        auVar67 = vfmadd213ps_fma(auVar41,auVar95,auVar97);
        auVar98 = vsubps_avx(auVar106,ZEXT1632(auVar67));
        auVar99 = vfmadd213ps_avx512vl(auVar113,auVar105,auVar102);
        auVar101 = vmulps_avx512vl(auVar101,auVar99);
        auVar99 = vmulps_avx512vl(local_760,auVar105);
        auVar102 = vmulps_avx512vl(local_780,auVar105);
        auVar106 = vmulps_avx512vl(auVar83,auVar105);
        auVar67 = vfmadd213ps_fma(auVar93,auVar101,auVar218);
        auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar94,auVar101,auVar96);
        auVar93 = vsubps_avx512vl(auVar102,ZEXT1632(auVar67));
        auVar67 = vfmadd213ps_fma(auVar95,auVar101,auVar97);
        auVar94 = vsubps_avx512vl(auVar106,ZEXT1632(auVar67));
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar197,auVar104);
        bVar59 = (bool)((byte)uVar61 & 1);
        auVar126._0_4_ = (uint)bVar59 * auVar95._0_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar59 * auVar95._4_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar59 * auVar95._8_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar59 * auVar95._12_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar59 * auVar95._16_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar59 * auVar95._20_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar59 * auVar95._24_4_ | (uint)!bVar59 * 0x7f800000;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar126._28_4_ = (uint)bVar59 * auVar95._28_4_ | (uint)!bVar59 * 0x7f800000;
        auVar219._8_4_ = 0xff800000;
        auVar219._0_8_ = 0xff800000ff800000;
        auVar219._12_4_ = 0xff800000;
        auVar219._16_4_ = 0xff800000;
        auVar219._20_4_ = 0xff800000;
        auVar219._24_4_ = 0xff800000;
        auVar219._28_4_ = 0xff800000;
        auVar95 = vblendmps_avx512vl(auVar219,auVar105);
        bVar59 = (bool)((byte)uVar61 & 1);
        auVar127._0_4_ = (uint)bVar59 * auVar95._0_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar59 * auVar95._4_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar59 * auVar95._8_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar59 * auVar95._12_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar59 * auVar95._16_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar59 * auVar95._20_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar59 * auVar95._24_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar127._28_4_ = (uint)bVar59 * auVar95._28_4_ | (uint)!bVar59 * -0x800000;
        auVar28._8_4_ = 0x36000000;
        auVar28._0_8_ = 0x3600000036000000;
        auVar28._12_4_ = 0x36000000;
        auVar28._16_4_ = 0x36000000;
        auVar28._20_4_ = 0x36000000;
        auVar28._24_4_ = 0x36000000;
        auVar28._28_4_ = 0x36000000;
        auVar95 = vmulps_avx512vl(local_800,auVar28);
        uVar52 = vcmpps_avx512vl(auVar95,local_820,0xe);
        uVar61 = uVar61 & uVar52;
        bVar51 = (byte)uVar61;
        if (bVar51 != 0) {
          uVar52 = vcmpps_avx512vl(auVar78,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar235._8_4_ = 0x7f800000;
          auVar235._0_8_ = 0x7f8000007f800000;
          auVar235._12_4_ = 0x7f800000;
          auVar235._16_4_ = 0x7f800000;
          auVar235._20_4_ = 0x7f800000;
          auVar235._24_4_ = 0x7f800000;
          auVar235._28_4_ = 0x7f800000;
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar78 = vblendmps_avx512vl(auVar235,auVar237);
          bVar53 = (byte)uVar52;
          uVar62 = (uint)(bVar53 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar95._0_4_;
          bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
          uVar135 = (uint)bVar59 * auVar78._4_4_ | (uint)!bVar59 * auVar95._4_4_;
          bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
          uVar136 = (uint)bVar59 * auVar78._8_4_ | (uint)!bVar59 * auVar95._8_4_;
          bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
          uVar137 = (uint)bVar59 * auVar78._12_4_ | (uint)!bVar59 * auVar95._12_4_;
          bVar59 = (bool)((byte)(uVar52 >> 4) & 1);
          uVar138 = (uint)bVar59 * auVar78._16_4_ | (uint)!bVar59 * auVar95._16_4_;
          bVar59 = (bool)((byte)(uVar52 >> 5) & 1);
          uVar139 = (uint)bVar59 * auVar78._20_4_ | (uint)!bVar59 * auVar95._20_4_;
          bVar59 = (bool)((byte)(uVar52 >> 6) & 1);
          uVar140 = (uint)bVar59 * auVar78._24_4_ | (uint)!bVar59 * auVar95._24_4_;
          bVar59 = SUB81(uVar52 >> 7,0);
          uVar141 = (uint)bVar59 * auVar78._28_4_ | (uint)!bVar59 * auVar95._28_4_;
          auVar126._0_4_ = (bVar51 & 1) * uVar62 | !(bool)(bVar51 & 1) * auVar126._0_4_;
          bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar126._4_4_ = bVar59 * uVar135 | !bVar59 * auVar126._4_4_;
          bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar126._8_4_ = bVar59 * uVar136 | !bVar59 * auVar126._8_4_;
          bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar126._12_4_ = bVar59 * uVar137 | !bVar59 * auVar126._12_4_;
          bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar126._16_4_ = bVar59 * uVar138 | !bVar59 * auVar126._16_4_;
          bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar126._20_4_ = bVar59 * uVar139 | !bVar59 * auVar126._20_4_;
          bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar126._24_4_ = bVar59 * uVar140 | !bVar59 * auVar126._24_4_;
          bVar59 = SUB81(uVar61 >> 7,0);
          auVar126._28_4_ = bVar59 * uVar141 | !bVar59 * auVar126._28_4_;
          auVar78 = vblendmps_avx512vl(auVar237,auVar235);
          bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar52 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar52 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar52 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar52 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar52 >> 6) & 1);
          bVar11 = SUB81(uVar52 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar51 & 1) *
               ((uint)(bVar53 & 1) * auVar78._0_4_ | !(bool)(bVar53 & 1) * uVar62) |
               !(bool)(bVar51 & 1) * auVar127._0_4_;
          bVar5 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar5 * ((uint)bVar59 * auVar78._4_4_ | !bVar59 * uVar135) |
               !bVar5 * auVar127._4_4_;
          bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar59 * ((uint)bVar6 * auVar78._8_4_ | !bVar6 * uVar136) |
               !bVar59 * auVar127._8_4_;
          bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar59 * ((uint)bVar7 * auVar78._12_4_ | !bVar7 * uVar137) |
               !bVar59 * auVar127._12_4_;
          bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar59 * ((uint)bVar8 * auVar78._16_4_ | !bVar8 * uVar138) |
               !bVar59 * auVar127._16_4_;
          bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar59 * ((uint)bVar9 * auVar78._20_4_ | !bVar9 * uVar139) |
               !bVar59 * auVar127._20_4_;
          bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar59 * ((uint)bVar10 * auVar78._24_4_ | !bVar10 * uVar140) |
               !bVar59 * auVar127._24_4_;
          bVar59 = SUB81(uVar61 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar59 * ((uint)bVar11 * auVar78._28_4_ | !bVar11 * uVar141) |
               !bVar59 * auVar127._28_4_;
          bVar50 = (~bVar51 | bVar53) & bVar50;
        }
      }
      auVar78 = vmulps_avx512vl(auVar83,auVar94);
      auVar67 = vfmadd231ps_fma(auVar78,local_780,auVar93);
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),local_760,auVar99);
      auVar231._8_4_ = 0x7fffffff;
      auVar231._0_8_ = 0x7fffffff7fffffff;
      auVar231._12_4_ = 0x7fffffff;
      auVar231._16_4_ = 0x7fffffff;
      auVar231._20_4_ = 0x7fffffff;
      auVar231._24_4_ = 0x7fffffff;
      auVar231._28_4_ = 0x7fffffff;
      auVar78 = vandps_avx(ZEXT1632(auVar67),auVar231);
      _local_440 = auVar92;
      auVar227._8_4_ = 0x3e99999a;
      auVar227._0_8_ = 0x3e99999a3e99999a;
      auVar227._12_4_ = 0x3e99999a;
      auVar227._16_4_ = 0x3e99999a;
      auVar227._20_4_ = 0x3e99999a;
      auVar227._24_4_ = 0x3e99999a;
      auVar227._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar78,auVar227,1);
      local_6c0._0_2_ = (short)uVar14;
      local_660 = vmaxps_avx(auVar92,auVar127);
      auVar78 = vminps_avx(local_640,auVar126);
      uVar14 = vcmpps_avx512vl(auVar92,auVar78,2);
      bVar51 = (byte)uVar14 & bVar45;
      uVar15 = vcmpps_avx512vl(local_660,local_640,2);
      if ((bVar45 & ((byte)uVar15 | (byte)uVar14)) == 0) {
        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar220 = ZEXT3264(local_8e0);
      }
      else {
        auVar78 = vmulps_avx512vl(auVar83,auVar98);
        auVar67 = vfmadd213ps_fma(auVar103,local_780,auVar78);
        auVar67 = vfmadd213ps_fma(auVar100,local_760,ZEXT1632(auVar67));
        auVar78 = vandps_avx(ZEXT1632(auVar67),auVar231);
        uVar14 = vcmpps_avx512vl(auVar78,auVar227,1);
        bVar53 = (byte)uVar14 | ~bVar50;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar78 = vpblendmd_avx512vl(auVar152,auVar29);
        local_600._0_4_ = (uint)(bVar53 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar59 = (bool)(bVar53 >> 1 & 1);
        local_600._4_4_ = (uint)bVar59 * auVar78._4_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar53 >> 2 & 1);
        local_600._8_4_ = (uint)bVar59 * auVar78._8_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar53 >> 3 & 1);
        local_600._12_4_ = (uint)bVar59 * auVar78._12_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar53 >> 4 & 1);
        local_600._16_4_ = (uint)bVar59 * auVar78._16_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar53 >> 5 & 1);
        local_600._20_4_ = (uint)bVar59 * auVar78._20_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar53 >> 6 & 1);
        local_600._24_4_ = (uint)bVar59 * auVar78._24_4_ | (uint)!bVar59 * 2;
        local_600._28_4_ = (uint)(bVar53 >> 7) * auVar78._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
        local_680 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_680,local_600,5);
        bVar53 = (byte)uVar14 & bVar51;
        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        if (bVar53 == 0) {
          auVar154._4_4_ = uVar63;
          auVar154._0_4_ = uVar63;
          auVar154._8_4_ = uVar63;
          auVar154._12_4_ = uVar63;
          auVar154._16_4_ = uVar63;
          auVar154._20_4_ = uVar63;
          auVar154._24_4_ = uVar63;
          auVar154._28_4_ = uVar63;
          auVar78 = local_660;
        }
        else {
          local_620 = local_660;
          auVar1 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar67 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar64 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar72 = vminps_avx(auVar1,auVar64);
          auVar1 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar64 = vmaxps_avx(auVar67,auVar1);
          auVar75._8_4_ = 0x7fffffff;
          auVar75._0_8_ = 0x7fffffff7fffffff;
          auVar75._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar72,auVar75);
          auVar1 = vandps_avx(auVar64,auVar75);
          auVar67 = vmaxps_avx(auVar67,auVar1);
          auVar1 = vmovshdup_avx(auVar67);
          auVar1 = vmaxss_avx(auVar1,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar1);
          fVar157 = auVar67._0_4_ * 1.9073486e-06;
          local_950 = vshufps_avx(auVar64,auVar64,0xff);
          local_c80 = auVar92._0_4_;
          fStack_c7c = auVar92._4_4_;
          fStack_c78 = auVar92._8_4_;
          fStack_c74 = auVar92._12_4_;
          fStack_c70 = auVar92._16_4_;
          fStack_c6c = auVar92._20_4_;
          fStack_c68 = auVar92._24_4_;
          fStack_c64 = auVar92._28_4_;
          local_6a0 = local_c80 + fVar142;
          fStack_69c = fStack_c7c + fVar142;
          fStack_698 = fStack_c78 + fVar142;
          fStack_694 = fStack_c74 + fVar142;
          fStack_690 = fStack_c70 + fVar142;
          fStack_68c = fStack_c6c + fVar142;
          fStack_688 = fStack_c68 + fVar142;
          fStack_684 = fStack_c64 + fVar142;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar78 = vblendmps_avx512vl(auVar153,auVar92);
            auVar129._0_4_ =
                 (uint)(bVar53 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
            bVar59 = (bool)(bVar53 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar59 * auVar78._4_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar53 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar59 * auVar78._8_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar53 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar59 * auVar78._12_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar53 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar59 * auVar78._16_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar53 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar59 * auVar78._20_4_ | (uint)!bVar59 * 0x7f800000;
            auVar129._24_4_ =
                 (uint)(bVar53 >> 6) * auVar78._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
            auVar129._28_4_ = 0x7f800000;
            auVar78 = vshufps_avx(auVar129,auVar129,0xb1);
            auVar78 = vminps_avx(auVar129,auVar78);
            auVar93 = vshufpd_avx(auVar78,auVar78,5);
            auVar78 = vminps_avx(auVar78,auVar93);
            auVar93 = vpermpd_avx2(auVar78,0x4e);
            auVar78 = vminps_avx(auVar78,auVar93);
            uVar14 = vcmpps_avx512vl(auVar129,auVar78,0);
            bVar46 = (byte)uVar14 & bVar53;
            bVar47 = bVar53;
            if (bVar46 != 0) {
              bVar47 = bVar46;
            }
            iVar17 = 0;
            for (uVar63 = (uint)bVar47; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar63 = *(uint *)(local_520 + (uint)(iVar17 << 2));
            uVar62 = *(uint *)(local_440 + (uint)(iVar17 << 2));
            fVar169 = auVar12._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar169 = sqrtf((float)local_9c0._0_4_);
            }
            auVar67 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar63),0x10);
            auVar220 = ZEXT1664(auVar67);
            bVar59 = true;
            uVar61 = 0;
            do {
              uVar143 = auVar220._0_4_;
              auVar144._4_4_ = uVar143;
              auVar144._0_4_ = uVar143;
              auVar144._8_4_ = uVar143;
              auVar144._12_4_ = uVar143;
              auVar1 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_9b0);
              auVar64 = auVar220._0_16_;
              auVar67 = vmovshdup_avx(auVar64);
              local_7e0._0_16_ = auVar67;
              fVar201 = 1.0 - auVar67._0_4_;
              auVar67 = vshufps_avx(auVar64,auVar64,0x55);
              fVar170 = auVar67._0_4_;
              auVar176._0_4_ = local_8a0._0_4_ * fVar170;
              fVar171 = auVar67._4_4_;
              auVar176._4_4_ = local_8a0._4_4_ * fVar171;
              fVar173 = auVar67._8_4_;
              auVar176._8_4_ = local_8a0._8_4_ * fVar173;
              fVar172 = auVar67._12_4_;
              auVar176._12_4_ = local_8a0._12_4_ * fVar172;
              _local_7c0 = ZEXT416((uint)fVar201);
              auVar203._4_4_ = fVar201;
              auVar203._0_4_ = fVar201;
              auVar203._8_4_ = fVar201;
              auVar203._12_4_ = fVar201;
              auVar67 = vfmadd231ps_fma(auVar176,auVar203,local_860._0_16_);
              auVar214._0_4_ = local_880._0_4_ * fVar170;
              auVar214._4_4_ = local_880._4_4_ * fVar171;
              auVar214._8_4_ = local_880._8_4_ * fVar173;
              auVar214._12_4_ = local_880._12_4_ * fVar172;
              auVar64 = vfmadd231ps_fma(auVar214,auVar203,local_8a0._0_16_);
              auVar221._0_4_ = fVar170 * (float)local_8c0._0_4_;
              auVar221._4_4_ = fVar171 * (float)local_8c0._4_4_;
              auVar221._8_4_ = fVar173 * fStack_8b8;
              auVar221._12_4_ = fVar172 * fStack_8b4;
              auVar72 = vfmadd231ps_fma(auVar221,auVar203,local_880._0_16_);
              auVar228._0_4_ = fVar170 * auVar64._0_4_;
              auVar228._4_4_ = fVar171 * auVar64._4_4_;
              auVar228._8_4_ = fVar173 * auVar64._8_4_;
              auVar228._12_4_ = fVar172 * auVar64._12_4_;
              auVar67 = vfmadd231ps_fma(auVar228,auVar203,auVar67);
              auVar177._0_4_ = fVar170 * auVar72._0_4_;
              auVar177._4_4_ = fVar171 * auVar72._4_4_;
              auVar177._8_4_ = fVar173 * auVar72._8_4_;
              auVar177._12_4_ = fVar172 * auVar72._12_4_;
              auVar64 = vfmadd231ps_fma(auVar177,auVar203,auVar64);
              auVar215._0_4_ = fVar170 * auVar64._0_4_;
              auVar215._4_4_ = fVar171 * auVar64._4_4_;
              auVar215._8_4_ = fVar173 * auVar64._8_4_;
              auVar215._12_4_ = fVar172 * auVar64._12_4_;
              auVar72 = vfmadd231ps_fma(auVar215,auVar67,auVar203);
              auVar67 = vsubps_avx(auVar64,auVar67);
              auVar76._8_4_ = 0x40400000;
              auVar76._0_8_ = 0x4040000040400000;
              auVar76._12_4_ = 0x40400000;
              auVar64 = vmulps_avx512vl(auVar67,auVar76);
              local_7a0._0_16_ = auVar72;
              auVar1 = vsubps_avx(auVar1,auVar72);
              auVar67 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar170 = auVar67._0_4_;
              local_740 = auVar220;
              if (fVar170 < 0.0) {
                auVar156._0_4_ = sqrtf(fVar170);
                auVar156._4_60_ = extraout_var;
                auVar72 = auVar156._0_16_;
              }
              else {
                auVar72 = vsqrtss_avx(auVar67,auVar67);
              }
              local_800._0_16_ = vdpps_avx(auVar64,auVar64,0x7f);
              fVar171 = local_800._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar171;
              local_9e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              fVar173 = local_9e0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar65 = vxorps_avx512vl(local_800._0_16_,auVar18);
              auVar68 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar68._0_4_;
              local_9a0._0_4_ = auVar72._0_4_;
              if (fVar171 < auVar65._0_4_) {
                fVar172 = sqrtf(fVar171);
                auVar72 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar68 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar172 = auVar68._0_4_;
              }
              fVar201 = local_9e0._0_4_;
              fVar171 = fVar173 * 1.5 + fVar171 * -0.5 * fVar201 * fVar201 * fVar201;
              auVar145._0_4_ = auVar64._0_4_ * fVar171;
              auVar145._4_4_ = auVar64._4_4_ * fVar171;
              auVar145._8_4_ = auVar64._8_4_ * fVar171;
              auVar145._12_4_ = auVar64._12_4_ * fVar171;
              local_9e0._0_16_ = vdpps_avx(auVar1,auVar145,0x7f);
              auVar65 = vaddss_avx512f(auVar72,ZEXT416(0x3f800000));
              auVar146._0_4_ = local_9e0._0_4_ * local_9e0._0_4_;
              auVar146._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
              auVar146._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
              auVar146._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
              auVar67 = vsubps_avx(auVar67,auVar146);
              fVar173 = auVar67._0_4_;
              auVar159._4_12_ = ZEXT812(0) << 0x20;
              auVar159._0_4_ = fVar173;
              auVar68 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
              auVar69 = vmulss_avx512f(auVar68,ZEXT416(0x3fc00000));
              auVar70 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
              uVar60 = fVar173 == 0.0;
              uVar58 = fVar173 < 0.0;
              if ((bool)uVar58) {
                local_910._0_4_ = fVar172;
                local_930._0_4_ = auVar69._0_4_;
                local_940._4_4_ = fVar171;
                local_940._0_4_ = fVar171;
                fStack_938 = fVar171;
                fStack_934 = fVar171;
                local_920 = auVar68;
                fVar173 = sqrtf(fVar173);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar69 = ZEXT416((uint)local_930._0_4_);
                auVar72 = ZEXT416((uint)local_9a0._0_4_);
                auVar65 = ZEXT416(auVar65._0_4_);
                auVar68 = local_920;
                fVar171 = (float)local_940._0_4_;
                fVar201 = (float)local_940._4_4_;
                fVar174 = fStack_938;
                fVar240 = fStack_934;
                fVar172 = (float)local_910._0_4_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar67,auVar67);
                fVar173 = auVar67._0_4_;
                fVar201 = fVar171;
                fVar174 = fVar171;
                fVar240 = fVar171;
              }
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar175 = auVar67._0_4_ * 6.0;
              fVar13 = local_7e0._0_4_ * 6.0;
              auVar204._0_4_ = fVar13 * (float)local_8c0._0_4_;
              auVar204._4_4_ = fVar13 * (float)local_8c0._4_4_;
              auVar204._8_4_ = fVar13 * fStack_8b8;
              auVar204._12_4_ = fVar13 * fStack_8b4;
              auVar179._4_4_ = fVar175;
              auVar179._0_4_ = fVar175;
              auVar179._8_4_ = fVar175;
              auVar179._12_4_ = fVar175;
              auVar67 = vfmadd132ps_fma(auVar179,auVar204,local_880._0_16_);
              fVar175 = auVar73._0_4_ * 6.0;
              auVar160._4_4_ = fVar175;
              auVar160._0_4_ = fVar175;
              auVar160._8_4_ = fVar175;
              auVar160._12_4_ = fVar175;
              auVar67 = vfmadd132ps_fma(auVar160,auVar67,local_8a0._0_16_);
              fVar175 = local_7c0._0_4_ * 6.0;
              auVar180._4_4_ = fVar175;
              auVar180._0_4_ = fVar175;
              auVar180._8_4_ = fVar175;
              auVar180._12_4_ = fVar175;
              auVar67 = vfmadd132ps_fma(auVar180,auVar67,local_860._0_16_);
              auVar161._0_4_ = auVar67._0_4_ * (float)local_800._0_4_;
              auVar161._4_4_ = auVar67._4_4_ * (float)local_800._0_4_;
              auVar161._8_4_ = auVar67._8_4_ * (float)local_800._0_4_;
              auVar161._12_4_ = auVar67._12_4_ * (float)local_800._0_4_;
              auVar67 = vdpps_avx(auVar64,auVar67,0x7f);
              fVar175 = auVar67._0_4_;
              auVar181._0_4_ = auVar64._0_4_ * fVar175;
              auVar181._4_4_ = auVar64._4_4_ * fVar175;
              auVar181._8_4_ = auVar64._8_4_ * fVar175;
              auVar181._12_4_ = auVar64._12_4_ * fVar175;
              auVar67 = vsubps_avx(auVar161,auVar181);
              fVar175 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar73 = vmaxss_avx(ZEXT416((uint)fVar157),
                                   ZEXT416((uint)(local_740._0_4_ * fVar169 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar71 = vxorps_avx512vl(auVar64,auVar19);
              auVar182._0_4_ = fVar171 * auVar67._0_4_ * fVar175;
              auVar182._4_4_ = fVar201 * auVar67._4_4_ * fVar175;
              auVar182._8_4_ = fVar174 * auVar67._8_4_ * fVar175;
              auVar182._12_4_ = fVar240 * auVar67._12_4_ * fVar175;
              auVar67 = vdpps_avx(auVar71,auVar145,0x7f);
              auVar74 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar157),auVar73);
              auVar72 = vdpps_avx(auVar1,auVar182,0x7f);
              vfmadd213ss_avx512f(auVar65,ZEXT416((uint)(fVar157 / fVar172)),auVar74);
              fVar171 = auVar67._0_4_ + auVar72._0_4_;
              auVar67 = vdpps_avx(local_9b0,auVar145,0x7f);
              auVar72 = vdpps_avx(auVar1,auVar71,0x7f);
              auVar65 = vmulss_avx512f(auVar70,auVar68);
              auVar68 = vmulss_avx512f(auVar68,auVar68);
              auVar69 = vaddss_avx512f(auVar69,ZEXT416((uint)(auVar65._0_4_ * auVar68._0_4_)));
              auVar68 = vdpps_avx(auVar1,local_9b0,0x7f);
              auVar70 = vfnmadd231ss_avx512f(auVar72,local_9e0._0_16_,ZEXT416((uint)fVar171));
              auVar68 = vfnmadd231ss_avx512f(auVar68,local_9e0._0_16_,auVar67);
              auVar72 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar173 = fVar173 - auVar72._0_4_;
              auVar65 = vshufps_avx(auVar64,auVar64,0xff);
              auVar72 = vfmsub213ss_fma(auVar70,auVar69,auVar65);
              auVar232._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar68 = ZEXT416((uint)(auVar68._0_4_ * auVar69._0_4_));
              auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar171),auVar68);
              auVar72 = vinsertps_avx(auVar232,auVar68,0x1c);
              auVar222._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar68 = vinsertps_avx(ZEXT416((uint)fVar171),auVar222,0x10);
              auVar205._0_4_ = auVar69._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar67 = vdivps_avx(auVar72,auVar205);
              auVar72 = vdivps_avx(auVar68,auVar205);
              auVar68 = vbroadcastss_avx512vl(local_9e0._0_16_);
              auVar206._0_4_ = auVar68._0_4_ * auVar67._0_4_ + fVar173 * auVar72._0_4_;
              auVar206._4_4_ = auVar68._4_4_ * auVar67._4_4_ + fVar173 * auVar72._4_4_;
              auVar206._8_4_ = auVar68._8_4_ * auVar67._8_4_ + fVar173 * auVar72._8_4_;
              auVar206._12_4_ = auVar68._12_4_ * auVar67._12_4_ + fVar173 * auVar72._12_4_;
              auVar67 = vsubps_avx(local_740._0_16_,auVar206);
              auVar220 = ZEXT1664(auVar67);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(local_9e0._0_16_,auVar20);
              auVar72 = vucomiss_avx512f(auVar72);
              if (!(bool)uVar58 && !(bool)uVar60) {
                auVar72 = vaddss_avx512f(auVar73,auVar72);
                auVar72 = vfmadd231ss_fma(auVar72,local_950,ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar68 = vandps_avx512vl(ZEXT416((uint)fVar173),auVar21);
                if (auVar68._0_4_ < auVar72._0_4_) {
                  fVar169 = auVar67._0_4_ + (float)local_960._0_4_;
                  auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar169 < fVar202) {
                    bVar47 = 0;
                    goto LAB_01c7e348;
                  }
                  fVar171 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar169 <= fVar171) {
                    auVar67 = vmovshdup_avx(auVar67);
                    bVar47 = 0;
                    if ((auVar67._0_4_ < 0.0) || (1.0 < auVar67._0_4_)) goto LAB_01c7e348;
                    auVar207._0_12_ = ZEXT812(0);
                    auVar207._12_4_ = 0;
                    auVar183._4_8_ = auVar207._4_8_;
                    auVar183._0_4_ = fVar170;
                    auVar183._12_4_ = 0;
                    auVar67 = vrsqrt14ss_avx512f(auVar207,auVar183);
                    fVar173 = auVar67._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar56].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar47 = 0;
                      goto LAB_01c7e348;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar47 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01c7e348;
                    fVar170 = fVar173 * 1.5 + fVar170 * -0.5 * fVar173 * fVar173 * fVar173;
                    auVar184._0_4_ = auVar1._0_4_ * fVar170;
                    auVar184._4_4_ = auVar1._4_4_ * fVar170;
                    auVar184._8_4_ = auVar1._8_4_ * fVar170;
                    auVar184._12_4_ = auVar1._12_4_ * fVar170;
                    auVar72 = vfmadd213ps_fma(auVar65,auVar184,auVar64);
                    auVar67 = vshufps_avx(auVar184,auVar184,0xc9);
                    auVar1 = vshufps_avx(auVar64,auVar64,0xc9);
                    auVar185._0_4_ = auVar184._0_4_ * auVar1._0_4_;
                    auVar185._4_4_ = auVar184._4_4_ * auVar1._4_4_;
                    auVar185._8_4_ = auVar184._8_4_ * auVar1._8_4_;
                    auVar185._12_4_ = auVar184._12_4_ * auVar1._12_4_;
                    auVar64 = vfmsub231ps_fma(auVar185,auVar64,auVar67);
                    auVar67 = vshufps_avx(auVar64,auVar64,0xc9);
                    auVar1 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar64 = vshufps_avx(auVar64,auVar64,0xd2);
                    auVar147._0_4_ = auVar72._0_4_ * auVar64._0_4_;
                    auVar147._4_4_ = auVar72._4_4_ * auVar64._4_4_;
                    auVar147._8_4_ = auVar72._8_4_ * auVar64._8_4_;
                    auVar147._12_4_ = auVar72._12_4_ * auVar64._12_4_;
                    auVar67 = vfmsub231ps_fma(auVar147,auVar67,auVar1);
                    auVar133 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar133,auVar220);
                    auVar220 = vpermps_avx512f(auVar133,ZEXT1664(auVar67));
                    auVar133 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar133,ZEXT1664(auVar67));
                    local_380 = vbroadcastss_avx512f(auVar67);
                    local_400[0] = (RTCHitN)auVar220[0];
                    local_400[1] = (RTCHitN)auVar220[1];
                    local_400[2] = (RTCHitN)auVar220[2];
                    local_400[3] = (RTCHitN)auVar220[3];
                    local_400[4] = (RTCHitN)auVar220[4];
                    local_400[5] = (RTCHitN)auVar220[5];
                    local_400[6] = (RTCHitN)auVar220[6];
                    local_400[7] = (RTCHitN)auVar220[7];
                    local_400[8] = (RTCHitN)auVar220[8];
                    local_400[9] = (RTCHitN)auVar220[9];
                    local_400[10] = (RTCHitN)auVar220[10];
                    local_400[0xb] = (RTCHitN)auVar220[0xb];
                    local_400[0xc] = (RTCHitN)auVar220[0xc];
                    local_400[0xd] = (RTCHitN)auVar220[0xd];
                    local_400[0xe] = (RTCHitN)auVar220[0xe];
                    local_400[0xf] = (RTCHitN)auVar220[0xf];
                    local_400[0x10] = (RTCHitN)auVar220[0x10];
                    local_400[0x11] = (RTCHitN)auVar220[0x11];
                    local_400[0x12] = (RTCHitN)auVar220[0x12];
                    local_400[0x13] = (RTCHitN)auVar220[0x13];
                    local_400[0x14] = (RTCHitN)auVar220[0x14];
                    local_400[0x15] = (RTCHitN)auVar220[0x15];
                    local_400[0x16] = (RTCHitN)auVar220[0x16];
                    local_400[0x17] = (RTCHitN)auVar220[0x17];
                    local_400[0x18] = (RTCHitN)auVar220[0x18];
                    local_400[0x19] = (RTCHitN)auVar220[0x19];
                    local_400[0x1a] = (RTCHitN)auVar220[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar220[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar220[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar220[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar220[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar220[0x1f];
                    local_400[0x20] = (RTCHitN)auVar220[0x20];
                    local_400[0x21] = (RTCHitN)auVar220[0x21];
                    local_400[0x22] = (RTCHitN)auVar220[0x22];
                    local_400[0x23] = (RTCHitN)auVar220[0x23];
                    local_400[0x24] = (RTCHitN)auVar220[0x24];
                    local_400[0x25] = (RTCHitN)auVar220[0x25];
                    local_400[0x26] = (RTCHitN)auVar220[0x26];
                    local_400[0x27] = (RTCHitN)auVar220[0x27];
                    local_400[0x28] = (RTCHitN)auVar220[0x28];
                    local_400[0x29] = (RTCHitN)auVar220[0x29];
                    local_400[0x2a] = (RTCHitN)auVar220[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar220[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar220[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar220[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar220[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar220[0x2f];
                    local_400[0x30] = (RTCHitN)auVar220[0x30];
                    local_400[0x31] = (RTCHitN)auVar220[0x31];
                    local_400[0x32] = (RTCHitN)auVar220[0x32];
                    local_400[0x33] = (RTCHitN)auVar220[0x33];
                    local_400[0x34] = (RTCHitN)auVar220[0x34];
                    local_400[0x35] = (RTCHitN)auVar220[0x35];
                    local_400[0x36] = (RTCHitN)auVar220[0x36];
                    local_400[0x37] = (RTCHitN)auVar220[0x37];
                    local_400[0x38] = (RTCHitN)auVar220[0x38];
                    local_400[0x39] = (RTCHitN)auVar220[0x39];
                    local_400[0x3a] = (RTCHitN)auVar220[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar220[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar220[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar220[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar220[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar220[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar220 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar220);
                    vpcmpeqd_avx2(auVar220._0_32_,auVar220._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar169;
                    auVar220 = vmovdqa64_avx512f(local_500);
                    local_700 = vmovdqa64_avx512f(auVar220);
                    local_a10.valid = (int *)local_700;
                    local_a10.geometryUserPtr = pGVar3->userPtr;
                    local_a10.context = context->user;
                    local_a10.hit = local_400;
                    local_a10.N = 0x10;
                    local_a10.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&local_a10);
                      auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar220 = vmovdqa64_avx512f(local_700);
                    }
                    uVar14 = vptestmd_avx512f(auVar220,auVar220);
                    if ((short)uVar14 != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&local_a10);
                        auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar220 = vmovdqa64_avx512f(local_700);
                      }
                      uVar61 = vptestmd_avx512f(auVar220,auVar220);
                      auVar133 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar5 = (bool)((byte)uVar61 & 1);
                      auVar220._0_4_ =
                           (uint)bVar5 * auVar133._0_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x200);
                      bVar5 = (bool)((byte)(uVar61 >> 1) & 1);
                      auVar220._4_4_ =
                           (uint)bVar5 * auVar133._4_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x204);
                      bVar5 = (bool)((byte)(uVar61 >> 2) & 1);
                      auVar220._8_4_ =
                           (uint)bVar5 * auVar133._8_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x208);
                      bVar5 = (bool)((byte)(uVar61 >> 3) & 1);
                      auVar220._12_4_ =
                           (uint)bVar5 * auVar133._12_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x20c);
                      bVar5 = (bool)((byte)(uVar61 >> 4) & 1);
                      auVar220._16_4_ =
                           (uint)bVar5 * auVar133._16_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x210);
                      bVar5 = (bool)((byte)(uVar61 >> 5) & 1);
                      auVar220._20_4_ =
                           (uint)bVar5 * auVar133._20_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x214);
                      bVar5 = (bool)((byte)(uVar61 >> 6) & 1);
                      auVar220._24_4_ =
                           (uint)bVar5 * auVar133._24_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x218);
                      bVar5 = (bool)((byte)(uVar61 >> 7) & 1);
                      auVar220._28_4_ =
                           (uint)bVar5 * auVar133._28_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x21c);
                      bVar5 = (bool)((byte)(uVar61 >> 8) & 1);
                      auVar220._32_4_ =
                           (uint)bVar5 * auVar133._32_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x220);
                      bVar5 = (bool)((byte)(uVar61 >> 9) & 1);
                      auVar220._36_4_ =
                           (uint)bVar5 * auVar133._36_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x224);
                      bVar5 = (bool)((byte)(uVar61 >> 10) & 1);
                      auVar220._40_4_ =
                           (uint)bVar5 * auVar133._40_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x228);
                      bVar5 = (bool)((byte)(uVar61 >> 0xb) & 1);
                      auVar220._44_4_ =
                           (uint)bVar5 * auVar133._44_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x22c);
                      bVar5 = (bool)((byte)(uVar61 >> 0xc) & 1);
                      auVar220._48_4_ =
                           (uint)bVar5 * auVar133._48_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x230);
                      bVar5 = (bool)((byte)(uVar61 >> 0xd) & 1);
                      auVar220._52_4_ =
                           (uint)bVar5 * auVar133._52_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x234);
                      bVar5 = (bool)((byte)(uVar61 >> 0xe) & 1);
                      auVar220._56_4_ =
                           (uint)bVar5 * auVar133._56_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x238);
                      bVar5 = SUB81(uVar61 >> 0xf,0);
                      auVar220._60_4_ =
                           (uint)bVar5 * auVar133._60_4_ |
                           (uint)!bVar5 * *(int *)(local_a10.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a10.ray + 0x200) = auVar220;
                      bVar47 = 1;
                      if ((short)uVar61 != 0) goto LAB_01c7e348;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar171;
                  }
                  bVar47 = 0;
                  goto LAB_01c7e348;
                }
              }
              bVar59 = uVar61 < 4;
              uVar61 = uVar61 + 1;
            } while (uVar61 != 5);
            bVar59 = false;
            auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar47 = 5;
LAB_01c7e348:
            bVar57 = (bool)(bVar57 | bVar59 & bVar47);
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar154._4_4_ = uVar143;
            auVar154._0_4_ = uVar143;
            auVar154._8_4_ = uVar143;
            auVar154._12_4_ = uVar143;
            auVar154._16_4_ = uVar143;
            auVar154._20_4_ = uVar143;
            auVar154._24_4_ = uVar143;
            auVar154._28_4_ = uVar143;
            auVar42._4_4_ = fStack_69c;
            auVar42._0_4_ = local_6a0;
            auVar42._8_4_ = fStack_698;
            auVar42._12_4_ = fStack_694;
            auVar42._16_4_ = fStack_690;
            auVar42._20_4_ = fStack_68c;
            auVar42._24_4_ = fStack_688;
            auVar42._28_4_ = fStack_684;
            uVar14 = vcmpps_avx512vl(auVar154,auVar42,0xd);
            bVar53 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar53 & (byte)uVar14;
            auVar78 = local_620;
          } while (bVar53 != 0);
        }
        auVar92 = local_660;
        bVar50 = local_6c0[0] | ~bVar50;
        auVar167._0_4_ = fVar142 + auVar78._0_4_;
        auVar167._4_4_ = fVar142 + auVar78._4_4_;
        auVar167._8_4_ = fVar142 + auVar78._8_4_;
        auVar167._12_4_ = fVar142 + auVar78._12_4_;
        auVar167._16_4_ = fVar142 + auVar78._16_4_;
        auVar167._20_4_ = fVar142 + auVar78._20_4_;
        auVar167._24_4_ = fVar142 + auVar78._24_4_;
        auVar167._28_4_ = fVar142 + auVar78._28_4_;
        uVar14 = vcmpps_avx512vl(auVar167,auVar154,2);
        bVar53 = (byte)uVar15 & bVar45 & (byte)uVar14;
        auVar168._8_4_ = 2;
        auVar168._0_8_ = 0x200000002;
        auVar168._12_4_ = 2;
        auVar168._16_4_ = 2;
        auVar168._20_4_ = 2;
        auVar168._24_4_ = 2;
        auVar168._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar78 = vpblendmd_avx512vl(auVar168,auVar30);
        auVar130._0_4_ = (uint)(bVar50 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar50 & 1) * 2;
        bVar59 = (bool)(bVar50 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar59 * auVar78._4_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar50 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar59 * auVar78._8_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar50 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar59 * auVar78._12_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar50 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar59 * auVar78._16_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar50 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar59 * auVar78._20_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar50 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar59 * auVar78._24_4_ | (uint)!bVar59 * 2;
        auVar130._28_4_ = (uint)(bVar50 >> 7) * auVar78._28_4_ | (uint)!(bool)(bVar50 >> 7) * 2;
        uVar14 = vpcmpd_avx512vl(local_680,auVar130,5);
        bVar45 = (byte)uVar14 & bVar53;
        if (bVar45 != 0) {
          auVar1 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar67 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar64 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar72 = vminps_avx(auVar1,auVar64);
          auVar1 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar64 = vmaxps_avx(auVar67,auVar1);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar72,auVar186);
          auVar1 = vandps_avx(auVar64,auVar186);
          auVar67 = vmaxps_avx(auVar67,auVar1);
          auVar1 = vmovshdup_avx(auVar67);
          auVar1 = vmaxss_avx(auVar1,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar1);
          fVar157 = auVar67._0_4_ * 1.9073486e-06;
          local_950 = vshufps_avx(auVar64,auVar64,0xff);
          local_6a0 = fVar142 + local_660._0_4_;
          fStack_69c = fVar142 + local_660._4_4_;
          fStack_698 = fVar142 + local_660._8_4_;
          fStack_694 = fVar142 + local_660._12_4_;
          fStack_690 = fVar142 + local_660._16_4_;
          fStack_68c = fVar142 + local_660._20_4_;
          fStack_688 = fVar142 + local_660._24_4_;
          fStack_684 = fVar142 + local_660._28_4_;
          local_6c0 = auVar130;
          do {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar78 = vblendmps_avx512vl(auVar155,auVar92);
            auVar131._0_4_ =
                 (uint)(bVar45 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar45 & 1) * 0x7f800000;
            bVar59 = (bool)(bVar45 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar59 * auVar78._4_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar45 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar59 * auVar78._8_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar45 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar59 * auVar78._12_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar45 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar59 * auVar78._16_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar45 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar59 * auVar78._20_4_ | (uint)!bVar59 * 0x7f800000;
            auVar131._24_4_ =
                 (uint)(bVar45 >> 6) * auVar78._24_4_ | (uint)!(bool)(bVar45 >> 6) * 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar78 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar78 = vminps_avx(auVar131,auVar78);
            auVar93 = vshufpd_avx(auVar78,auVar78,5);
            auVar78 = vminps_avx(auVar78,auVar93);
            auVar93 = vpermpd_avx2(auVar78,0x4e);
            auVar78 = vminps_avx(auVar78,auVar93);
            uVar14 = vcmpps_avx512vl(auVar131,auVar78,0);
            bVar47 = (byte)uVar14 & bVar45;
            bVar50 = bVar45;
            if (bVar47 != 0) {
              bVar50 = bVar47;
            }
            iVar17 = 0;
            for (uVar63 = (uint)bVar50; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
              iVar17 = iVar17 + 1;
            }
            uVar63 = *(uint *)(local_540 + (uint)(iVar17 << 2));
            uVar62 = *(uint *)(local_640 + (uint)(iVar17 << 2));
            fVar169 = auVar66._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar169 = sqrtf((float)local_9c0._0_4_);
            }
            auVar67 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar63),0x10);
            auVar220 = ZEXT1664(auVar67);
            bVar59 = true;
            uVar61 = 0;
            do {
              uVar143 = auVar220._0_4_;
              auVar148._4_4_ = uVar143;
              auVar148._0_4_ = uVar143;
              auVar148._8_4_ = uVar143;
              auVar148._12_4_ = uVar143;
              auVar1 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_9b0);
              auVar64 = auVar220._0_16_;
              auVar67 = vmovshdup_avx(auVar64);
              local_7e0._0_16_ = auVar67;
              fVar201 = 1.0 - auVar67._0_4_;
              auVar67 = vshufps_avx(auVar64,auVar64,0x55);
              fVar170 = auVar67._0_4_;
              auVar187._0_4_ = local_8a0._0_4_ * fVar170;
              fVar171 = auVar67._4_4_;
              auVar187._4_4_ = local_8a0._4_4_ * fVar171;
              fVar173 = auVar67._8_4_;
              auVar187._8_4_ = local_8a0._8_4_ * fVar173;
              fVar172 = auVar67._12_4_;
              auVar187._12_4_ = local_8a0._12_4_ * fVar172;
              _local_7c0 = ZEXT416((uint)fVar201);
              auVar208._4_4_ = fVar201;
              auVar208._0_4_ = fVar201;
              auVar208._8_4_ = fVar201;
              auVar208._12_4_ = fVar201;
              auVar67 = vfmadd231ps_fma(auVar187,auVar208,local_860._0_16_);
              auVar216._0_4_ = local_880._0_4_ * fVar170;
              auVar216._4_4_ = local_880._4_4_ * fVar171;
              auVar216._8_4_ = local_880._8_4_ * fVar173;
              auVar216._12_4_ = local_880._12_4_ * fVar172;
              auVar64 = vfmadd231ps_fma(auVar216,auVar208,local_8a0._0_16_);
              auVar223._0_4_ = fVar170 * (float)local_8c0._0_4_;
              auVar223._4_4_ = fVar171 * (float)local_8c0._4_4_;
              auVar223._8_4_ = fVar173 * fStack_8b8;
              auVar223._12_4_ = fVar172 * fStack_8b4;
              auVar72 = vfmadd231ps_fma(auVar223,auVar208,local_880._0_16_);
              auVar229._0_4_ = fVar170 * auVar64._0_4_;
              auVar229._4_4_ = fVar171 * auVar64._4_4_;
              auVar229._8_4_ = fVar173 * auVar64._8_4_;
              auVar229._12_4_ = fVar172 * auVar64._12_4_;
              auVar67 = vfmadd231ps_fma(auVar229,auVar208,auVar67);
              auVar188._0_4_ = fVar170 * auVar72._0_4_;
              auVar188._4_4_ = fVar171 * auVar72._4_4_;
              auVar188._8_4_ = fVar173 * auVar72._8_4_;
              auVar188._12_4_ = fVar172 * auVar72._12_4_;
              auVar64 = vfmadd231ps_fma(auVar188,auVar208,auVar64);
              auVar217._0_4_ = fVar170 * auVar64._0_4_;
              auVar217._4_4_ = fVar171 * auVar64._4_4_;
              auVar217._8_4_ = fVar173 * auVar64._8_4_;
              auVar217._12_4_ = fVar172 * auVar64._12_4_;
              auVar72 = vfmadd231ps_fma(auVar217,auVar67,auVar208);
              auVar67 = vsubps_avx(auVar64,auVar67);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar64 = vmulps_avx512vl(auVar67,auVar22);
              local_7a0._0_16_ = auVar72;
              auVar1 = vsubps_avx(auVar1,auVar72);
              auVar67 = vdpps_avx(auVar1,auVar1,0x7f);
              fVar170 = auVar67._0_4_;
              local_740 = auVar220;
              if (fVar170 < 0.0) {
                auVar133._0_4_ = sqrtf(fVar170);
                auVar133._4_60_ = extraout_var_00;
                auVar72 = auVar133._0_16_;
              }
              else {
                auVar72 = vsqrtss_avx(auVar67,auVar67);
              }
              local_800._0_16_ = vdpps_avx(auVar64,auVar64,0x7f);
              fVar171 = local_800._0_4_;
              auVar189._4_12_ = ZEXT812(0) << 0x20;
              auVar189._0_4_ = fVar171;
              local_9e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              fVar173 = local_9e0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar65 = vxorps_avx512vl(local_800._0_16_,auVar23);
              auVar68 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar68._0_4_;
              local_9a0._0_4_ = auVar72._0_4_;
              if (fVar171 < auVar65._0_4_) {
                fVar172 = sqrtf(fVar171);
                auVar72 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar68 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar172 = auVar68._0_4_;
              }
              fVar201 = local_9e0._0_4_;
              auVar65 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar173 * 1.5 +
                                                 fVar171 * -0.5 * fVar201 * fVar201 * fVar201)));
              auVar68 = vmulps_avx512vl(auVar64,auVar65);
              local_9e0._0_16_ = vdpps_avx(auVar1,auVar68,0x7f);
              auVar70 = vaddss_avx512f(auVar72,ZEXT416(0x3f800000));
              auVar149._0_4_ = local_9e0._0_4_ * local_9e0._0_4_;
              auVar149._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
              auVar149._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
              auVar149._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
              auVar67 = vsubps_avx(auVar67,auVar149);
              fVar171 = auVar67._0_4_;
              auVar162._4_12_ = ZEXT812(0) << 0x20;
              auVar162._0_4_ = fVar171;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
              auVar73 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar74 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
              uVar60 = fVar171 == 0.0;
              uVar58 = fVar171 < 0.0;
              if ((bool)uVar58) {
                local_920._0_4_ = auVar73._0_4_;
                _local_940 = auVar65;
                local_930 = auVar68;
                local_910 = auVar69;
                fVar171 = sqrtf(fVar171);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar73 = ZEXT416((uint)local_920._0_4_);
                auVar72 = ZEXT416((uint)local_9a0._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar68 = local_930;
                auVar69 = local_910;
                auVar65 = _local_940;
              }
              else {
                auVar67 = vsqrtss_avx(auVar67,auVar67);
                fVar171 = auVar67._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar65);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar173 = auVar67._0_4_ * 6.0;
              fVar201 = local_7e0._0_4_ * 6.0;
              auVar209._0_4_ = fVar201 * (float)local_8c0._0_4_;
              auVar209._4_4_ = fVar201 * (float)local_8c0._4_4_;
              auVar209._8_4_ = fVar201 * fStack_8b8;
              auVar209._12_4_ = fVar201 * fStack_8b4;
              auVar190._4_4_ = fVar173;
              auVar190._0_4_ = fVar173;
              auVar190._8_4_ = fVar173;
              auVar190._12_4_ = fVar173;
              auVar67 = vfmadd132ps_fma(auVar190,auVar209,local_880._0_16_);
              fVar173 = auVar71._0_4_ * 6.0;
              auVar163._4_4_ = fVar173;
              auVar163._0_4_ = fVar173;
              auVar163._8_4_ = fVar173;
              auVar163._12_4_ = fVar173;
              auVar67 = vfmadd132ps_fma(auVar163,auVar67,local_8a0._0_16_);
              fVar173 = local_7c0._0_4_ * 6.0;
              auVar191._4_4_ = fVar173;
              auVar191._0_4_ = fVar173;
              auVar191._8_4_ = fVar173;
              auVar191._12_4_ = fVar173;
              auVar67 = vfmadd132ps_fma(auVar191,auVar67,local_860._0_16_);
              auVar164._0_4_ = auVar67._0_4_ * (float)local_800._0_4_;
              auVar164._4_4_ = auVar67._4_4_ * (float)local_800._0_4_;
              auVar164._8_4_ = auVar67._8_4_ * (float)local_800._0_4_;
              auVar164._12_4_ = auVar67._12_4_ * (float)local_800._0_4_;
              auVar67 = vdpps_avx(auVar64,auVar67,0x7f);
              fVar173 = auVar67._0_4_;
              auVar192._0_4_ = auVar64._0_4_ * fVar173;
              auVar192._4_4_ = auVar64._4_4_ * fVar173;
              auVar192._8_4_ = auVar64._8_4_ * fVar173;
              auVar192._12_4_ = auVar64._12_4_ * fVar173;
              auVar67 = vsubps_avx(auVar164,auVar192);
              fVar173 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar71 = vmaxss_avx(ZEXT416((uint)fVar157),
                                   ZEXT416((uint)(local_740._0_4_ * fVar169 * 1.9073486e-06)));
              auVar193._0_4_ = auVar67._0_4_ * fVar173;
              auVar193._4_4_ = auVar67._4_4_ * fVar173;
              auVar193._8_4_ = auVar67._8_4_ * fVar173;
              auVar193._12_4_ = auVar67._12_4_ * fVar173;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar75 = vxorps_avx512vl(auVar64,auVar24);
              auVar76 = vmulps_avx512vl(auVar65,auVar193);
              auVar67 = vdpps_avx(auVar75,auVar68,0x7f);
              auVar65 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar157),auVar71);
              auVar72 = vdpps_avx(auVar1,auVar76,0x7f);
              vfmadd213ss_avx512f(auVar70,ZEXT416((uint)(fVar157 / fVar172)),auVar65);
              fVar173 = auVar67._0_4_ + auVar72._0_4_;
              auVar67 = vdpps_avx(local_9b0,auVar68,0x7f);
              auVar72 = vdpps_avx(auVar1,auVar75,0x7f);
              auVar68 = vmulss_avx512f(auVar74,auVar69);
              auVar65 = vmulss_avx512f(auVar69,auVar69);
              auVar69 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar68._0_4_ * auVar65._0_4_)));
              auVar68 = vdpps_avx(auVar1,local_9b0,0x7f);
              auVar70 = vfnmadd231ss_avx512f(auVar72,local_9e0._0_16_,ZEXT416((uint)fVar173));
              auVar68 = vfnmadd231ss_avx512f(auVar68,local_9e0._0_16_,auVar67);
              auVar72 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar171 = fVar171 - auVar72._0_4_;
              auVar65 = vshufps_avx(auVar64,auVar64,0xff);
              auVar72 = vfmsub213ss_fma(auVar70,auVar69,auVar65);
              auVar233._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar68 = ZEXT416((uint)(auVar68._0_4_ * auVar69._0_4_));
              auVar69 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar173),auVar68);
              auVar72 = vinsertps_avx(auVar233,auVar68,0x1c);
              auVar224._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar68 = vinsertps_avx(ZEXT416((uint)fVar173),auVar224,0x10);
              auVar210._0_4_ = auVar69._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar67 = vdivps_avx(auVar72,auVar210);
              auVar72 = vdivps_avx(auVar68,auVar210);
              auVar68 = vbroadcastss_avx512vl(local_9e0._0_16_);
              auVar211._0_4_ = auVar68._0_4_ * auVar67._0_4_ + fVar171 * auVar72._0_4_;
              auVar211._4_4_ = auVar68._4_4_ * auVar67._4_4_ + fVar171 * auVar72._4_4_;
              auVar211._8_4_ = auVar68._8_4_ * auVar67._8_4_ + fVar171 * auVar72._8_4_;
              auVar211._12_4_ = auVar68._12_4_ * auVar67._12_4_ + fVar171 * auVar72._12_4_;
              auVar67 = vsubps_avx(local_740._0_16_,auVar211);
              auVar220 = ZEXT1664(auVar67);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(local_9e0._0_16_,auVar25);
              auVar72 = vucomiss_avx512f(auVar72);
              if (!(bool)uVar58 && !(bool)uVar60) {
                auVar72 = vaddss_avx512f(auVar71,auVar72);
                auVar72 = vfmadd231ss_fma(auVar72,local_950,ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar68 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar26);
                if (auVar68._0_4_ < auVar72._0_4_) {
                  fVar169 = auVar67._0_4_ + (float)local_960._0_4_;
                  auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar169 < fVar202) {
                    bVar50 = 0;
                    goto LAB_01c7efb1;
                  }
                  fVar171 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar171 < fVar169) {
                    bVar50 = 0;
                    goto LAB_01c7efb1;
                  }
                  auVar67 = vmovshdup_avx(auVar67);
                  bVar50 = 0;
                  if ((auVar67._0_4_ < 0.0) || (1.0 < auVar67._0_4_)) goto LAB_01c7efb1;
                  auVar212._0_12_ = ZEXT812(0);
                  auVar212._12_4_ = 0;
                  auVar194._4_8_ = auVar212._4_8_;
                  auVar194._0_4_ = fVar170;
                  auVar194._12_4_ = 0;
                  auVar67 = vrsqrt14ss_avx512f(auVar212,auVar194);
                  fVar173 = auVar67._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar56].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar50 = 0;
                    goto LAB_01c7efb1;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar50 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01c7efb1;
                  fVar170 = fVar173 * 1.5 + fVar170 * -0.5 * fVar173 * fVar173 * fVar173;
                  auVar195._0_4_ = auVar1._0_4_ * fVar170;
                  auVar195._4_4_ = auVar1._4_4_ * fVar170;
                  auVar195._8_4_ = auVar1._8_4_ * fVar170;
                  auVar195._12_4_ = auVar1._12_4_ * fVar170;
                  auVar72 = vfmadd213ps_fma(auVar65,auVar195,auVar64);
                  auVar67 = vshufps_avx(auVar195,auVar195,0xc9);
                  auVar1 = vshufps_avx(auVar64,auVar64,0xc9);
                  auVar196._0_4_ = auVar195._0_4_ * auVar1._0_4_;
                  auVar196._4_4_ = auVar195._4_4_ * auVar1._4_4_;
                  auVar196._8_4_ = auVar195._8_4_ * auVar1._8_4_;
                  auVar196._12_4_ = auVar195._12_4_ * auVar1._12_4_;
                  auVar64 = vfmsub231ps_fma(auVar196,auVar64,auVar67);
                  auVar67 = vshufps_avx(auVar64,auVar64,0xc9);
                  auVar1 = vshufps_avx(auVar72,auVar72,0xc9);
                  auVar64 = vshufps_avx(auVar64,auVar64,0xd2);
                  auVar150._0_4_ = auVar72._0_4_ * auVar64._0_4_;
                  auVar150._4_4_ = auVar72._4_4_ * auVar64._4_4_;
                  auVar150._8_4_ = auVar72._8_4_ * auVar64._8_4_;
                  auVar150._12_4_ = auVar72._12_4_ * auVar64._12_4_;
                  auVar67 = vfmsub231ps_fma(auVar150,auVar67,auVar1);
                  auVar133 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar133,auVar220);
                  auVar220 = vpermps_avx512f(auVar133,ZEXT1664(auVar67));
                  auVar133 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar133,ZEXT1664(auVar67));
                  local_380 = vbroadcastss_avx512f(auVar67);
                  local_400[0] = (RTCHitN)auVar220[0];
                  local_400[1] = (RTCHitN)auVar220[1];
                  local_400[2] = (RTCHitN)auVar220[2];
                  local_400[3] = (RTCHitN)auVar220[3];
                  local_400[4] = (RTCHitN)auVar220[4];
                  local_400[5] = (RTCHitN)auVar220[5];
                  local_400[6] = (RTCHitN)auVar220[6];
                  local_400[7] = (RTCHitN)auVar220[7];
                  local_400[8] = (RTCHitN)auVar220[8];
                  local_400[9] = (RTCHitN)auVar220[9];
                  local_400[10] = (RTCHitN)auVar220[10];
                  local_400[0xb] = (RTCHitN)auVar220[0xb];
                  local_400[0xc] = (RTCHitN)auVar220[0xc];
                  local_400[0xd] = (RTCHitN)auVar220[0xd];
                  local_400[0xe] = (RTCHitN)auVar220[0xe];
                  local_400[0xf] = (RTCHitN)auVar220[0xf];
                  local_400[0x10] = (RTCHitN)auVar220[0x10];
                  local_400[0x11] = (RTCHitN)auVar220[0x11];
                  local_400[0x12] = (RTCHitN)auVar220[0x12];
                  local_400[0x13] = (RTCHitN)auVar220[0x13];
                  local_400[0x14] = (RTCHitN)auVar220[0x14];
                  local_400[0x15] = (RTCHitN)auVar220[0x15];
                  local_400[0x16] = (RTCHitN)auVar220[0x16];
                  local_400[0x17] = (RTCHitN)auVar220[0x17];
                  local_400[0x18] = (RTCHitN)auVar220[0x18];
                  local_400[0x19] = (RTCHitN)auVar220[0x19];
                  local_400[0x1a] = (RTCHitN)auVar220[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar220[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar220[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar220[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar220[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar220[0x1f];
                  local_400[0x20] = (RTCHitN)auVar220[0x20];
                  local_400[0x21] = (RTCHitN)auVar220[0x21];
                  local_400[0x22] = (RTCHitN)auVar220[0x22];
                  local_400[0x23] = (RTCHitN)auVar220[0x23];
                  local_400[0x24] = (RTCHitN)auVar220[0x24];
                  local_400[0x25] = (RTCHitN)auVar220[0x25];
                  local_400[0x26] = (RTCHitN)auVar220[0x26];
                  local_400[0x27] = (RTCHitN)auVar220[0x27];
                  local_400[0x28] = (RTCHitN)auVar220[0x28];
                  local_400[0x29] = (RTCHitN)auVar220[0x29];
                  local_400[0x2a] = (RTCHitN)auVar220[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar220[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar220[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar220[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar220[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar220[0x2f];
                  local_400[0x30] = (RTCHitN)auVar220[0x30];
                  local_400[0x31] = (RTCHitN)auVar220[0x31];
                  local_400[0x32] = (RTCHitN)auVar220[0x32];
                  local_400[0x33] = (RTCHitN)auVar220[0x33];
                  local_400[0x34] = (RTCHitN)auVar220[0x34];
                  local_400[0x35] = (RTCHitN)auVar220[0x35];
                  local_400[0x36] = (RTCHitN)auVar220[0x36];
                  local_400[0x37] = (RTCHitN)auVar220[0x37];
                  local_400[0x38] = (RTCHitN)auVar220[0x38];
                  local_400[0x39] = (RTCHitN)auVar220[0x39];
                  local_400[0x3a] = (RTCHitN)auVar220[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar220[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar220[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar220[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar220[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar220[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar220 = vmovdqa64_avx512f(local_4c0);
                  local_280 = vmovdqa64_avx512f(auVar220);
                  vpcmpeqd_avx2(auVar220._0_32_,auVar220._0_32_);
                  local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar169;
                  auVar220 = vmovdqa64_avx512f(local_500);
                  local_700 = vmovdqa64_avx512f(auVar220);
                  local_a10.valid = (int *)local_700;
                  local_a10.geometryUserPtr = pGVar3->userPtr;
                  local_a10.context = context->user;
                  local_a10.hit = local_400;
                  local_a10.N = 0x10;
                  local_a10.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_a10);
                    auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    auVar220 = vmovdqa64_avx512f(local_700);
                  }
                  uVar14 = vptestmd_avx512f(auVar220,auVar220);
                  if ((short)uVar14 != 0) {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_a10);
                      auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar220 = vmovdqa64_avx512f(local_700);
                    }
                    uVar61 = vptestmd_avx512f(auVar220,auVar220);
                    auVar220 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar5 = (bool)((byte)uVar61 & 1);
                    auVar134._0_4_ =
                         (uint)bVar5 * auVar220._0_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x200);
                    bVar5 = (bool)((byte)(uVar61 >> 1) & 1);
                    auVar134._4_4_ =
                         (uint)bVar5 * auVar220._4_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x204);
                    bVar5 = (bool)((byte)(uVar61 >> 2) & 1);
                    auVar134._8_4_ =
                         (uint)bVar5 * auVar220._8_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x208);
                    bVar5 = (bool)((byte)(uVar61 >> 3) & 1);
                    auVar134._12_4_ =
                         (uint)bVar5 * auVar220._12_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x20c);
                    bVar5 = (bool)((byte)(uVar61 >> 4) & 1);
                    auVar134._16_4_ =
                         (uint)bVar5 * auVar220._16_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x210);
                    bVar5 = (bool)((byte)(uVar61 >> 5) & 1);
                    auVar134._20_4_ =
                         (uint)bVar5 * auVar220._20_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x214);
                    bVar5 = (bool)((byte)(uVar61 >> 6) & 1);
                    auVar134._24_4_ =
                         (uint)bVar5 * auVar220._24_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x218);
                    bVar5 = (bool)((byte)(uVar61 >> 7) & 1);
                    auVar134._28_4_ =
                         (uint)bVar5 * auVar220._28_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x21c);
                    bVar5 = (bool)((byte)(uVar61 >> 8) & 1);
                    auVar134._32_4_ =
                         (uint)bVar5 * auVar220._32_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x220);
                    bVar5 = (bool)((byte)(uVar61 >> 9) & 1);
                    auVar134._36_4_ =
                         (uint)bVar5 * auVar220._36_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x224);
                    bVar5 = (bool)((byte)(uVar61 >> 10) & 1);
                    auVar134._40_4_ =
                         (uint)bVar5 * auVar220._40_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x228);
                    bVar5 = (bool)((byte)(uVar61 >> 0xb) & 1);
                    auVar134._44_4_ =
                         (uint)bVar5 * auVar220._44_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x22c);
                    bVar5 = (bool)((byte)(uVar61 >> 0xc) & 1);
                    auVar134._48_4_ =
                         (uint)bVar5 * auVar220._48_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x230);
                    bVar5 = (bool)((byte)(uVar61 >> 0xd) & 1);
                    auVar134._52_4_ =
                         (uint)bVar5 * auVar220._52_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x234);
                    bVar5 = (bool)((byte)(uVar61 >> 0xe) & 1);
                    auVar134._56_4_ =
                         (uint)bVar5 * auVar220._56_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x238);
                    bVar5 = SUB81(uVar61 >> 0xf,0);
                    auVar134._60_4_ =
                         (uint)bVar5 * auVar220._60_4_ |
                         (uint)!bVar5 * *(int *)(local_a10.ray + 0x23c);
                    *(undefined1 (*) [64])(local_a10.ray + 0x200) = auVar134;
                    bVar50 = 1;
                    if ((short)uVar61 != 0) goto LAB_01c7efb1;
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar171;
                  bVar50 = 0;
                  goto LAB_01c7efb1;
                }
              }
              bVar59 = uVar61 < 4;
              uVar61 = uVar61 + 1;
            } while (uVar61 != 5);
            bVar59 = false;
            auVar156 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar50 = 5;
LAB_01c7efb1:
            bVar57 = (bool)(bVar57 | bVar59 & bVar50);
            uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar154._4_4_ = uVar143;
            auVar154._0_4_ = uVar143;
            auVar154._8_4_ = uVar143;
            auVar154._12_4_ = uVar143;
            auVar154._16_4_ = uVar143;
            auVar154._20_4_ = uVar143;
            auVar154._24_4_ = uVar143;
            auVar154._28_4_ = uVar143;
            auVar43._4_4_ = fStack_69c;
            auVar43._0_4_ = local_6a0;
            auVar43._8_4_ = fStack_698;
            auVar43._12_4_ = fStack_694;
            auVar43._16_4_ = fStack_690;
            auVar43._20_4_ = fStack_68c;
            auVar43._24_4_ = fStack_688;
            auVar43._28_4_ = fStack_684;
            uVar14 = vcmpps_avx512vl(auVar154,auVar43,0xd);
            bVar45 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar45 & (byte)uVar14;
            auVar130 = local_6c0;
          } while (bVar45 != 0);
        }
        auVar220 = ZEXT3264(local_8e0);
        uVar15 = vpcmpgtd_avx512vl(auVar130,local_680);
        uVar16 = vpcmpd_avx512vl(local_680,local_600,1);
        auVar199._0_4_ = fVar142 + (float)local_440._0_4_;
        auVar199._4_4_ = fVar142 + (float)local_440._4_4_;
        auVar199._8_4_ = fVar142 + fStack_438;
        auVar199._12_4_ = fVar142 + fStack_434;
        auVar199._16_4_ = fVar142 + fStack_430;
        auVar199._20_4_ = fVar142 + fStack_42c;
        auVar199._24_4_ = fVar142 + fStack_428;
        auVar199._28_4_ = fVar142 + fStack_424;
        uVar14 = vcmpps_avx512vl(auVar199,auVar154,2);
        bVar51 = bVar51 & (byte)uVar16 & (byte)uVar14;
        auVar200._0_4_ = fVar142 + local_660._0_4_;
        auVar200._4_4_ = fVar142 + local_660._4_4_;
        auVar200._8_4_ = fVar142 + local_660._8_4_;
        auVar200._12_4_ = fVar142 + local_660._12_4_;
        auVar200._16_4_ = fVar142 + local_660._16_4_;
        auVar200._20_4_ = fVar142 + local_660._20_4_;
        auVar200._24_4_ = fVar142 + local_660._24_4_;
        auVar200._28_4_ = fVar142 + local_660._28_4_;
        uVar14 = vcmpps_avx512vl(auVar200,auVar154,2);
        bVar45 = bVar53 & (byte)uVar15 & (byte)uVar14 | bVar51;
        prim = local_8f0;
        pPVar55 = local_8f8;
        if (bVar45 != 0) {
          abStack_1a0[uVar48 * 0x60] = bVar45;
          auVar132._0_4_ =
               (uint)(bVar51 & 1) * local_440._0_4_ |
               (uint)!(bool)(bVar51 & 1) * (int)local_660._0_4_;
          bVar59 = (bool)(bVar51 >> 1 & 1);
          auVar132._4_4_ = (uint)bVar59 * local_440._4_4_ | (uint)!bVar59 * (int)local_660._4_4_;
          bVar59 = (bool)(bVar51 >> 2 & 1);
          auVar132._8_4_ = (uint)bVar59 * (int)fStack_438 | (uint)!bVar59 * (int)local_660._8_4_;
          bVar59 = (bool)(bVar51 >> 3 & 1);
          auVar132._12_4_ = (uint)bVar59 * (int)fStack_434 | (uint)!bVar59 * (int)local_660._12_4_;
          bVar59 = (bool)(bVar51 >> 4 & 1);
          auVar132._16_4_ = (uint)bVar59 * (int)fStack_430 | (uint)!bVar59 * (int)local_660._16_4_;
          bVar59 = (bool)(bVar51 >> 5 & 1);
          auVar132._20_4_ = (uint)bVar59 * (int)fStack_42c | (uint)!bVar59 * (int)local_660._20_4_;
          auVar132._24_4_ =
               (uint)(bVar51 >> 6) * (int)fStack_428 |
               (uint)!(bool)(bVar51 >> 6) * (int)local_660._24_4_;
          auVar132._28_4_ = local_660._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar48 * 0x60) = auVar132;
          uVar61 = vmovlps_avx(local_970);
          (&uStack_160)[uVar48 * 0xc] = uVar61;
          aiStack_158[uVar48 * 0x18] = iVar54 + 1;
          uVar48 = (ulong)((int)uVar48 + 1);
        }
      }
    }
    do {
      uVar63 = (uint)uVar48;
      uVar48 = (ulong)(uVar63 - 1);
      if (uVar63 == 0) {
        if (bVar57 != false) {
          return bVar57;
        }
        uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar143;
        auVar32._0_4_ = uVar143;
        auVar32._8_4_ = uVar143;
        auVar32._12_4_ = uVar143;
        auVar32._16_4_ = uVar143;
        auVar32._20_4_ = uVar143;
        auVar32._24_4_ = uVar143;
        auVar32._28_4_ = uVar143;
        uVar14 = vcmpps_avx512vl(local_5e0,auVar32,2);
        uVar56 = (uint)local_8e8 & (uint)uVar14;
        local_8e8 = (ulong)uVar56;
        if (uVar56 == 0) {
          return false;
        }
        goto LAB_01c7c859;
      }
      lVar49 = uVar48 * 0x60;
      auVar78 = *(undefined1 (*) [32])(auStack_180 + lVar49);
      auVar165._0_4_ = fVar142 + auVar78._0_4_;
      auVar165._4_4_ = fVar142 + auVar78._4_4_;
      auVar165._8_4_ = fVar142 + auVar78._8_4_;
      auVar165._12_4_ = fVar142 + auVar78._12_4_;
      auVar165._16_4_ = fVar142 + auVar78._16_4_;
      auVar165._20_4_ = fVar142 + auVar78._20_4_;
      auVar165._24_4_ = fVar142 + auVar78._24_4_;
      auVar165._28_4_ = fVar142 + auVar78._28_4_;
      uVar143 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar31._4_4_ = uVar143;
      auVar31._0_4_ = uVar143;
      auVar31._8_4_ = uVar143;
      auVar31._12_4_ = uVar143;
      auVar31._16_4_ = uVar143;
      auVar31._20_4_ = uVar143;
      auVar31._24_4_ = uVar143;
      auVar31._28_4_ = uVar143;
      uVar14 = vcmpps_avx512vl(auVar165,auVar31,2);
      uVar62 = (uint)uVar14 & (uint)abStack_1a0[lVar49];
    } while (uVar62 == 0);
    uVar61 = (&uStack_160)[uVar48 * 0xc];
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar61;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar198,auVar78);
    bVar45 = (byte)uVar62;
    auVar128._0_4_ =
         (uint)(bVar45 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar45 & 1) * (int)auVar78._0_4_;
    bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar59 * auVar92._4_4_ | (uint)!bVar59 * (int)auVar78._4_4_;
    bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar59 * auVar92._8_4_ | (uint)!bVar59 * (int)auVar78._8_4_;
    bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar59 * auVar92._12_4_ | (uint)!bVar59 * (int)auVar78._12_4_;
    bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar59 * auVar92._16_4_ | (uint)!bVar59 * (int)auVar78._16_4_;
    bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar59 * auVar92._20_4_ | (uint)!bVar59 * (int)auVar78._20_4_;
    bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar59 * auVar92._24_4_ | (uint)!bVar59 * (int)auVar78._24_4_;
    auVar128._28_4_ =
         (uVar62 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar62 >> 7,0) * (int)auVar78._28_4_;
    auVar78 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar78 = vminps_avx(auVar128,auVar78);
    auVar92 = vshufpd_avx(auVar78,auVar78,5);
    auVar78 = vminps_avx(auVar78,auVar92);
    auVar92 = vpermpd_avx2(auVar78,0x4e);
    auVar78 = vminps_avx(auVar78,auVar92);
    uVar14 = vcmpps_avx512vl(auVar128,auVar78,0);
    bVar50 = (byte)uVar14 & bVar45;
    if (bVar50 != 0) {
      uVar62 = (uint)bVar50;
    }
    uVar135 = 0;
    for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    iVar54 = aiStack_158[uVar48 * 0x18];
    bVar45 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar45;
    abStack_1a0[lVar49] = bVar45;
    if (bVar45 == 0) {
      uVar63 = uVar63 - 1;
    }
    uVar143 = (undefined4)uVar61;
    auVar151._4_4_ = uVar143;
    auVar151._0_4_ = uVar143;
    auVar151._8_4_ = uVar143;
    auVar151._12_4_ = uVar143;
    auVar151._16_4_ = uVar143;
    auVar151._20_4_ = uVar143;
    auVar151._24_4_ = uVar143;
    auVar151._28_4_ = uVar143;
    auVar67 = vmovshdup_avx(auVar158);
    auVar67 = vsubps_avx(auVar67,auVar158);
    auVar166._0_4_ = auVar67._0_4_;
    auVar166._4_4_ = auVar166._0_4_;
    auVar166._8_4_ = auVar166._0_4_;
    auVar166._12_4_ = auVar166._0_4_;
    auVar166._16_4_ = auVar166._0_4_;
    auVar166._20_4_ = auVar166._0_4_;
    auVar166._24_4_ = auVar166._0_4_;
    auVar166._28_4_ = auVar166._0_4_;
    auVar67 = vfmadd132ps_fma(auVar166,auVar151,_DAT_01faff20);
    auVar78 = ZEXT1632(auVar67);
    local_400[0] = (RTCHitN)auVar78[0];
    local_400[1] = (RTCHitN)auVar78[1];
    local_400[2] = (RTCHitN)auVar78[2];
    local_400[3] = (RTCHitN)auVar78[3];
    local_400[4] = (RTCHitN)auVar78[4];
    local_400[5] = (RTCHitN)auVar78[5];
    local_400[6] = (RTCHitN)auVar78[6];
    local_400[7] = (RTCHitN)auVar78[7];
    local_400[8] = (RTCHitN)auVar78[8];
    local_400[9] = (RTCHitN)auVar78[9];
    local_400[10] = (RTCHitN)auVar78[10];
    local_400[0xb] = (RTCHitN)auVar78[0xb];
    local_400[0xc] = (RTCHitN)auVar78[0xc];
    local_400[0xd] = (RTCHitN)auVar78[0xd];
    local_400[0xe] = (RTCHitN)auVar78[0xe];
    local_400[0xf] = (RTCHitN)auVar78[0xf];
    local_400[0x10] = (RTCHitN)auVar78[0x10];
    local_400[0x11] = (RTCHitN)auVar78[0x11];
    local_400[0x12] = (RTCHitN)auVar78[0x12];
    local_400[0x13] = (RTCHitN)auVar78[0x13];
    local_400[0x14] = (RTCHitN)auVar78[0x14];
    local_400[0x15] = (RTCHitN)auVar78[0x15];
    local_400[0x16] = (RTCHitN)auVar78[0x16];
    local_400[0x17] = (RTCHitN)auVar78[0x17];
    local_400[0x18] = (RTCHitN)auVar78[0x18];
    local_400[0x19] = (RTCHitN)auVar78[0x19];
    local_400[0x1a] = (RTCHitN)auVar78[0x1a];
    local_400[0x1b] = (RTCHitN)auVar78[0x1b];
    local_400[0x1c] = (RTCHitN)auVar78[0x1c];
    local_400[0x1d] = (RTCHitN)auVar78[0x1d];
    local_400[0x1e] = (RTCHitN)auVar78[0x1e];
    local_400[0x1f] = (RTCHitN)auVar78[0x1f];
    local_970._8_8_ = 0;
    local_970._0_8_ = *(ulong *)(local_400 + (ulong)uVar135 * 4);
    uVar48 = (ulong)uVar63;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }